

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  int iVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  byte bVar57;
  Geometry *geometry;
  long lVar58;
  ulong uVar59;
  ulong uVar60;
  bool bVar61;
  ulong uVar62;
  undefined8 unaff_R13;
  long lVar63;
  byte bVar64;
  ulong uVar65;
  float fVar66;
  float fVar67;
  float fVar116;
  float fVar118;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar77 [16];
  float fVar117;
  float fVar119;
  float fVar121;
  float fVar122;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar120;
  float fVar123;
  float fVar124;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined4 uVar125;
  float fVar132;
  float fVar133;
  vint4 bi_2;
  float fVar134;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined8 uVar135;
  vint4 bi_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  float fVar142;
  vint4 ai_2;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  vint4 bi;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  vint4 ai;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar161;
  float fVar164;
  vint4 ai_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 auVar169 [16];
  uint uVar170;
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5b0 [16];
  ulong local_598;
  undefined1 local_590 [16];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  Geometry *local_560;
  Precalculations *local_558;
  RTCFilterFunctionNArguments local_550;
  undefined1 local_520 [32];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  LinearSpace3fa *local_430;
  ulong local_428;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined8 local_360;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined1 local_2d0 [16];
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  uint local_2a0;
  uint uStack_29c;
  uint uStack_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  uint uStack_288;
  uint uStack_284;
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined1 local_1f0 [16];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar62 = (ulong)(byte)prim[1];
  fVar142 = *(float *)(prim + uVar62 * 0x19 + 0x12);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar75 = vsubps_avx(auVar75,*(undefined1 (*) [16])(prim + uVar62 * 0x19 + 6));
  auVar143._0_4_ = fVar142 * auVar75._0_4_;
  auVar143._4_4_ = fVar142 * auVar75._4_4_;
  auVar143._8_4_ = fVar142 * auVar75._8_4_;
  auVar143._12_4_ = fVar142 * auVar75._12_4_;
  auVar77._0_4_ = fVar142 * auVar74._0_4_;
  auVar77._4_4_ = fVar142 * auVar74._4_4_;
  auVar77._8_4_ = fVar142 * auVar74._8_4_;
  auVar77._12_4_ = fVar142 * auVar74._12_4_;
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xb + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xc + 6)));
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xd + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x12 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x13 + 6)));
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x14 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar174._4_4_ = auVar77._0_4_;
  auVar174._0_4_ = auVar77._0_4_;
  auVar174._8_4_ = auVar77._0_4_;
  auVar174._12_4_ = auVar77._0_4_;
  auVar20 = vshufps_avx(auVar77,auVar77,0x55);
  auVar71 = vshufps_avx(auVar77,auVar77,0xaa);
  fVar142 = auVar71._0_4_;
  auVar151._0_4_ = fVar142 * auVar68._0_4_;
  fVar132 = auVar71._4_4_;
  auVar151._4_4_ = fVar132 * auVar68._4_4_;
  fVar133 = auVar71._8_4_;
  auVar151._8_4_ = fVar133 * auVar68._8_4_;
  fVar134 = auVar71._12_4_;
  auVar151._12_4_ = fVar134 * auVar68._12_4_;
  auVar136._0_4_ = auVar69._0_4_ * fVar142;
  auVar136._4_4_ = auVar69._4_4_ * fVar132;
  auVar136._8_4_ = auVar69._8_4_ * fVar133;
  auVar136._12_4_ = auVar69._12_4_ * fVar134;
  auVar126._0_4_ = auVar70._0_4_ * fVar142;
  auVar126._4_4_ = auVar70._4_4_ * fVar132;
  auVar126._8_4_ = auVar70._8_4_ * fVar133;
  auVar126._12_4_ = auVar70._12_4_ * fVar134;
  auVar71 = vfmadd231ps_fma(auVar151,auVar20,auVar74);
  auVar73 = vfmadd231ps_fma(auVar136,auVar20,auVar76);
  auVar20 = vfmadd231ps_fma(auVar126,auVar19,auVar20);
  auVar72 = vfmadd231ps_fma(auVar71,auVar174,auVar75);
  auVar73 = vfmadd231ps_fma(auVar73,auVar174,auVar17);
  auVar77 = vfmadd231ps_fma(auVar20,auVar18,auVar174);
  auVar175._4_4_ = auVar143._0_4_;
  auVar175._0_4_ = auVar143._0_4_;
  auVar175._8_4_ = auVar143._0_4_;
  auVar175._12_4_ = auVar143._0_4_;
  auVar20 = vshufps_avx(auVar143,auVar143,0x55);
  auVar71 = vshufps_avx(auVar143,auVar143,0xaa);
  auVar68 = vmulps_avx512vl(auVar71,auVar68);
  auVar144._0_4_ = auVar71._0_4_ * auVar69._0_4_;
  auVar144._4_4_ = auVar71._4_4_ * auVar69._4_4_;
  auVar144._8_4_ = auVar71._8_4_ * auVar69._8_4_;
  auVar144._12_4_ = auVar71._12_4_ * auVar69._12_4_;
  auVar139._0_4_ = auVar71._0_4_ * auVar70._0_4_;
  auVar139._4_4_ = auVar71._4_4_ * auVar70._4_4_;
  auVar139._8_4_ = auVar71._8_4_ * auVar70._8_4_;
  auVar139._12_4_ = auVar71._12_4_ * auVar70._12_4_;
  auVar69 = vfmadd231ps_avx512vl(auVar68,auVar20,auVar74);
  auVar74 = vfmadd231ps_fma(auVar144,auVar20,auVar76);
  auVar68 = vfmadd231ps_fma(auVar139,auVar20,auVar19);
  auVar70 = vfmadd231ps_avx512vl(auVar69,auVar175,auVar75);
  auVar76 = vfmadd231ps_fma(auVar74,auVar175,auVar17);
  auVar19 = vfmadd231ps_fma(auVar68,auVar175,auVar18);
  auVar165._8_4_ = 0x7fffffff;
  auVar165._0_8_ = 0x7fffffff7fffffff;
  auVar165._12_4_ = 0x7fffffff;
  auVar157._8_4_ = 0x219392ef;
  auVar157._0_8_ = 0x219392ef219392ef;
  auVar157._12_4_ = 0x219392ef;
  auVar75 = vandps_avx(auVar72,auVar165);
  uVar65 = vcmpps_avx512vl(auVar75,auVar157,1);
  bVar61 = (bool)((byte)uVar65 & 1);
  auVar71._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar72._0_4_;
  bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar72._4_4_;
  bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar72._8_4_;
  bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar72._12_4_;
  auVar75 = vandps_avx(auVar73,auVar165);
  uVar65 = vcmpps_avx512vl(auVar75,auVar157,1);
  bVar61 = (bool)((byte)uVar65 & 1);
  auVar72._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar73._0_4_;
  bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar73._4_4_;
  bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar73._8_4_;
  bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar73._12_4_;
  auVar75 = vandps_avx(auVar77,auVar165);
  uVar65 = vcmpps_avx512vl(auVar75,auVar157,1);
  bVar61 = (bool)((byte)uVar65 & 1);
  auVar73._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar77._0_4_;
  bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar77._4_4_;
  bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar77._8_4_;
  bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar77._12_4_;
  auVar74 = vrcp14ps_avx512vl(auVar71);
  auVar162._8_4_ = 0x3f800000;
  auVar162._0_8_ = 0x3f8000003f800000;
  auVar162._12_4_ = 0x3f800000;
  auVar75 = vfnmadd213ps_fma(auVar71,auVar74,auVar162);
  auVar68 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar72);
  auVar75 = vfnmadd213ps_fma(auVar72,auVar74,auVar162);
  auVar69 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar73);
  auVar75 = vfnmadd213ps_fma(auVar73,auVar74,auVar162);
  auVar18 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx512vl(auVar75,auVar70);
  auVar158._0_4_ = auVar68._0_4_ * auVar75._0_4_;
  auVar158._4_4_ = auVar68._4_4_ * auVar75._4_4_;
  auVar158._8_4_ = auVar68._8_4_ * auVar75._8_4_;
  auVar158._12_4_ = auVar68._12_4_ * auVar75._12_4_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar75 = vpmovsxwd_avx(auVar74);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx512vl(auVar75,auVar70);
  auVar152._0_4_ = auVar68._0_4_ * auVar75._0_4_;
  auVar152._4_4_ = auVar68._4_4_ * auVar75._4_4_;
  auVar152._8_4_ = auVar68._8_4_ * auVar75._8_4_;
  auVar152._12_4_ = auVar68._12_4_ * auVar75._12_4_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar62 * 0xe + 6);
  auVar75 = vpmovsxwd_avx(auVar68);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar163._0_4_ = auVar69._0_4_ * auVar75._0_4_;
  auVar163._4_4_ = auVar69._4_4_ * auVar75._4_4_;
  auVar163._8_4_ = auVar69._8_4_ * auVar75._8_4_;
  auVar163._12_4_ = auVar69._12_4_ * auVar75._12_4_;
  auVar68 = vpbroadcastd_avx512vl();
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar75 = vpmovsxwd_avx(auVar17);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vsubps_avx(auVar75,auVar76);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar62 * 0x15 + 6);
  auVar75 = vpmovsxwd_avx(auVar76);
  auVar137._0_4_ = auVar69._0_4_ * auVar74._0_4_;
  auVar137._4_4_ = auVar69._4_4_ * auVar74._4_4_;
  auVar137._8_4_ = auVar69._8_4_ * auVar74._8_4_;
  auVar137._12_4_ = auVar69._12_4_ * auVar74._12_4_;
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar19);
  auVar145._0_4_ = auVar18._0_4_ * auVar75._0_4_;
  auVar145._4_4_ = auVar18._4_4_ * auVar75._4_4_;
  auVar145._8_4_ = auVar18._8_4_ * auVar75._8_4_;
  auVar145._12_4_ = auVar18._12_4_ * auVar75._12_4_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar62 * 0x17 + 6);
  auVar75 = vpmovsxwd_avx(auVar69);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar19);
  auVar127._0_4_ = auVar18._0_4_ * auVar75._0_4_;
  auVar127._4_4_ = auVar18._4_4_ * auVar75._4_4_;
  auVar127._8_4_ = auVar18._8_4_ * auVar75._8_4_;
  auVar127._12_4_ = auVar18._12_4_ * auVar75._12_4_;
  auVar75 = vpminsd_avx(auVar158,auVar152);
  auVar74 = vpminsd_avx(auVar163,auVar137);
  auVar75 = vmaxps_avx(auVar75,auVar74);
  auVar74 = vpminsd_avx(auVar145,auVar127);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar18._4_4_ = uVar125;
  auVar18._0_4_ = uVar125;
  auVar18._8_4_ = uVar125;
  auVar18._12_4_ = uVar125;
  auVar74 = vmaxps_avx512vl(auVar74,auVar18);
  auVar75 = vmaxps_avx(auVar75,auVar74);
  auVar19._8_4_ = 0x3f7ffffa;
  auVar19._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar19._12_4_ = 0x3f7ffffa;
  local_270 = vmulps_avx512vl(auVar75,auVar19);
  auVar75 = vpmaxsd_avx(auVar158,auVar152);
  auVar74 = vpmaxsd_avx(auVar163,auVar137);
  auVar75 = vminps_avx(auVar75,auVar74);
  auVar74 = vpmaxsd_avx(auVar145,auVar127);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar70._4_4_ = uVar125;
  auVar70._0_4_ = uVar125;
  auVar70._8_4_ = uVar125;
  auVar70._12_4_ = uVar125;
  auVar74 = vminps_avx512vl(auVar74,auVar70);
  auVar75 = vminps_avx(auVar75,auVar74);
  auVar20._8_4_ = 0x3f800003;
  auVar20._0_8_ = 0x3f8000033f800003;
  auVar20._12_4_ = 0x3f800003;
  auVar75 = vmulps_avx512vl(auVar75,auVar20);
  uVar135 = vcmpps_avx512vl(local_270,auVar75,2);
  uVar21 = vpcmpgtd_avx512vl(auVar68,_DAT_01f4ad30);
  local_428 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar135 & 0xf & (byte)uVar21));
  local_430 = pre->ray_space + k;
  local_380 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_558 = pre;
  while (local_428 != 0) {
    lVar63 = 0;
    for (uVar65 = local_428; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
      lVar63 = lVar63 + 1;
    }
    local_598 = (ulong)*(uint *)(prim + 2);
    pGVar9 = (context->scene->geometries).items[local_598].ptr;
    uVar65 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                             pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i * (ulong)*(uint *)(prim + lVar63 * 4 + 6));
    p_Var10 = pGVar9[1].intersectionFilterN;
    lVar63 = *(long *)&pGVar9[1].time_range.upper;
    local_590 = *(undefined1 (*) [16])(lVar63 + (long)p_Var10 * uVar65);
    pauVar3 = (undefined1 (*) [16])(lVar63 + (uVar65 + 1) * (long)p_Var10);
    local_570 = *(undefined8 *)*pauVar3;
    uStack_568 = *(undefined8 *)(*pauVar3 + 8);
    auVar75 = *pauVar3;
    pauVar4 = (undefined1 (*) [16])(lVar63 + (uVar65 + 2) * (long)p_Var10);
    local_580 = *(undefined8 *)*pauVar4;
    uStack_578 = *(undefined8 *)(*pauVar4 + 8);
    auVar74 = *pauVar4;
    uVar62 = local_428 - 1 & local_428;
    pauVar5 = (undefined1 (*) [12])(lVar63 + (uVar65 + 3) * (long)p_Var10);
    local_440 = (float)*(undefined8 *)*pauVar5;
    fStack_43c = (float)((ulong)*(undefined8 *)*pauVar5 >> 0x20);
    fStack_438 = (float)*(undefined8 *)(*pauVar5 + 8);
    fStack_434 = (float)((ulong)*(undefined8 *)(*pauVar5 + 8) >> 0x20);
    if (uVar62 != 0) {
      uVar60 = uVar62 - 1 & uVar62;
      for (uVar65 = uVar62; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
      }
      if (uVar60 != 0) {
        for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar76 = vsubps_avx(local_590,auVar68);
    uVar125 = auVar76._0_4_;
    auVar140._4_4_ = uVar125;
    auVar140._0_4_ = uVar125;
    auVar140._8_4_ = uVar125;
    auVar140._12_4_ = uVar125;
    auVar17 = vshufps_avx(auVar76,auVar76,0x55);
    auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
    aVar6 = (local_430->vx).field_0;
    aVar7 = (local_430->vy).field_0;
    fVar142 = (local_430->vz).field_0.m128[0];
    fVar132 = *(float *)((long)&(local_430->vz).field_0 + 4);
    fVar133 = *(float *)((long)&(local_430->vz).field_0 + 8);
    fVar134 = *(float *)((long)&(local_430->vz).field_0 + 0xc);
    auVar169._0_4_ = fVar142 * auVar76._0_4_;
    auVar169._4_4_ = fVar132 * auVar76._4_4_;
    auVar169._8_4_ = fVar133 * auVar76._8_4_;
    auVar169._12_4_ = fVar134 * auVar76._12_4_;
    auVar17 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar7,auVar17);
    auVar18 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar6,auVar140);
    auVar17 = vshufps_avx(local_590,local_590,0xff);
    auVar69 = vsubps_avx(auVar75,auVar68);
    uVar125 = auVar69._0_4_;
    auVar146._4_4_ = uVar125;
    auVar146._0_4_ = uVar125;
    auVar146._8_4_ = uVar125;
    auVar146._12_4_ = uVar125;
    auVar76 = vshufps_avx(auVar69,auVar69,0x55);
    auVar69 = vshufps_avx(auVar69,auVar69,0xaa);
    auVar171._0_4_ = fVar142 * auVar69._0_4_;
    auVar171._4_4_ = fVar132 * auVar69._4_4_;
    auVar171._8_4_ = fVar133 * auVar69._8_4_;
    auVar171._12_4_ = fVar134 * auVar69._12_4_;
    auVar76 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar7,auVar76);
    auVar19 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar6,auVar146);
    auVar75 = vshufps_avx(auVar75,auVar75,0xff);
    auVar69 = vsubps_avx(auVar74,auVar68);
    uVar125 = auVar69._0_4_;
    auVar166._4_4_ = uVar125;
    auVar166._0_4_ = uVar125;
    auVar166._8_4_ = uVar125;
    auVar166._12_4_ = uVar125;
    auVar76 = vshufps_avx(auVar69,auVar69,0x55);
    auVar69 = vshufps_avx(auVar69,auVar69,0xaa);
    auVar173._0_4_ = fVar142 * auVar69._0_4_;
    auVar173._4_4_ = fVar132 * auVar69._4_4_;
    auVar173._8_4_ = fVar133 * auVar69._8_4_;
    auVar173._12_4_ = fVar134 * auVar69._12_4_;
    auVar76 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar7,auVar76);
    auVar69 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar6,auVar166);
    auVar74 = vshufps_avx(auVar74,auVar74,0xff);
    auVar55._12_4_ = fStack_434;
    auVar55._0_12_ = *pauVar5;
    auVar76 = vsubps_avx512vl(auVar55,auVar68);
    uVar125 = auVar76._0_4_;
    auVar147._4_4_ = uVar125;
    auVar147._0_4_ = uVar125;
    auVar147._8_4_ = uVar125;
    auVar147._12_4_ = uVar125;
    auVar68 = vshufps_avx(auVar76,auVar76,0x55);
    auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
    auVar176._0_4_ = fVar142 * auVar76._0_4_;
    auVar176._4_4_ = fVar132 * auVar76._4_4_;
    auVar176._8_4_ = fVar133 * auVar76._8_4_;
    auVar176._12_4_ = fVar134 * auVar76._12_4_;
    auVar68 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar7,auVar68);
    auVar68 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar6,auVar147);
    auVar76 = vshufps_avx512vl(auVar55,auVar55,0xff);
    lVar63 = (long)iVar8 * 0x44;
    auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar63);
    local_3e0 = vbroadcastss_avx512vl(auVar18);
    auVar80._8_4_ = 1;
    auVar80._0_8_ = 0x100000001;
    auVar80._12_4_ = 1;
    auVar80._16_4_ = 1;
    auVar80._20_4_ = 1;
    auVar80._24_4_ = 1;
    auVar80._28_4_ = 1;
    local_3c0 = vpermps_avx512vl(auVar80,ZEXT1632(auVar18));
    uVar135 = auVar17._0_8_;
    local_80._8_8_ = uVar135;
    local_80._0_8_ = uVar135;
    local_80._16_8_ = uVar135;
    local_80._24_8_ = uVar135;
    auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x484);
    uVar125 = auVar19._0_4_;
    local_520._4_4_ = uVar125;
    local_520._0_4_ = uVar125;
    local_520._8_4_ = uVar125;
    local_520._12_4_ = uVar125;
    local_520._16_4_ = uVar125;
    local_520._20_4_ = uVar125;
    local_520._24_4_ = uVar125;
    local_520._28_4_ = uVar125;
    local_4e0 = vpermps_avx512vl(auVar80,ZEXT1632(auVar19));
    uVar135 = auVar75._0_8_;
    local_a0._8_8_ = uVar135;
    local_a0._0_8_ = uVar135;
    local_a0._16_8_ = uVar135;
    local_a0._24_8_ = uVar135;
    auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x908);
    local_480 = vbroadcastss_avx512vl(auVar69);
    local_400 = vpermps_avx2(auVar80,ZEXT1632(auVar69));
    local_c0 = vbroadcastsd_avx512vl(auVar74);
    auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0xd8c);
    local_4a0 = vbroadcastss_avx512vl(auVar68);
    auVar187 = ZEXT3264(local_4a0);
    local_4c0 = vpermps_avx512vl(auVar80,ZEXT1632(auVar68));
    auVar188 = ZEXT3264(local_4c0);
    _local_e0 = vbroadcastsd_avx512vl(auVar76);
    auVar80 = vmulps_avx512vl(local_4a0,auVar94);
    auVar81 = vmulps_avx512vl(local_4c0,auVar94);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar95,local_480);
    auVar75 = vfmadd231ps_fma(auVar81,auVar95,local_400);
    auVar74 = vfmadd231ps_fma(auVar80,auVar97,local_520);
    auVar80 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar97,local_4e0);
    auVar82 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar96,local_3e0);
    auVar83 = vfmadd231ps_avx512vl(auVar80,auVar96,local_3c0);
    auVar80 = *(undefined1 (*) [32])(bezier_basis1 + lVar63);
    auVar81 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x484);
    auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x908);
    auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0xd8c);
    auVar84 = vmulps_avx512vl(local_4a0,auVar92);
    auVar85 = vmulps_avx512vl(local_4c0,auVar92);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar93,local_480);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar93,local_400);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar81,local_520);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar81,local_4e0);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar80,local_3e0);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar80,local_3c0);
    auVar86 = vsubps_avx512vl(auVar84,auVar82);
    auVar87 = vsubps_avx512vl(auVar85,auVar83);
    auVar88 = vmulps_avx512vl(auVar83,auVar86);
    auVar89 = vmulps_avx512vl(auVar82,auVar87);
    auVar88 = vsubps_avx512vl(auVar88,auVar89);
    auVar89 = vmulps_avx512vl(_local_e0,auVar94);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar95,local_c0);
    auVar75 = vfmadd231ps_fma(auVar89,auVar97,local_a0);
    auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar96,local_80);
    auVar90 = vmulps_avx512vl(_local_e0,auVar92);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar93,local_c0);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar81,local_a0);
    auVar17 = vfmadd231ps_fma(auVar90,auVar80,local_80);
    auVar90 = vmulps_avx512vl(auVar87,auVar87);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar86,auVar86);
    auVar91 = vmaxps_avx512vl(auVar89,ZEXT1632(auVar17));
    auVar91 = vmulps_avx512vl(auVar91,auVar91);
    auVar90 = vmulps_avx512vl(auVar91,auVar90);
    auVar88 = vmulps_avx512vl(auVar88,auVar88);
    uVar135 = vcmpps_avx512vl(auVar88,auVar90,2);
    auVar75 = vblendps_avx(auVar18,local_590,8);
    auVar76 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar74 = vandps_avx512vl(auVar75,auVar76);
    auVar75 = vblendps_avx(auVar19,*pauVar3,8);
    auVar75 = vandps_avx512vl(auVar75,auVar76);
    auVar74 = vmaxps_avx(auVar74,auVar75);
    auVar75 = vblendps_avx(auVar69,*pauVar4,8);
    auVar70 = vandps_avx512vl(auVar75,auVar76);
    auVar75 = vblendps_avx(auVar68,auVar55,8);
    auVar75 = vandps_avx512vl(auVar75,auVar76);
    auVar75 = vmaxps_avx(auVar70,auVar75);
    auVar75 = vmaxps_avx(auVar74,auVar75);
    auVar74 = vmovshdup_avx(auVar75);
    auVar74 = vmaxss_avx(auVar74,auVar75);
    auVar75 = vshufpd_avx(auVar75,auVar75,1);
    local_4f0._0_4_ = (undefined4)iVar8;
    local_4f0._4_12_ = auVar18._4_12_;
    auVar75 = vmaxss_avx(auVar75,auVar74);
    auVar90._4_4_ = local_4f0._0_4_;
    auVar90._0_4_ = local_4f0._0_4_;
    auVar90._8_4_ = local_4f0._0_4_;
    auVar90._12_4_ = local_4f0._0_4_;
    auVar90._16_4_ = local_4f0._0_4_;
    auVar90._20_4_ = local_4f0._0_4_;
    auVar90._24_4_ = local_4f0._0_4_;
    auVar90._28_4_ = local_4f0._0_4_;
    uVar21 = vcmpps_avx512vl(auVar90,_DAT_01f7b060,0xe);
    bVar64 = (byte)uVar135 & (byte)uVar21;
    auVar75 = vmulss_avx512f(auVar75,ZEXT416(0x35000000));
    auVar88._8_4_ = 2;
    auVar88._0_8_ = 0x200000002;
    auVar88._12_4_ = 2;
    auVar88._16_4_ = 2;
    auVar88._20_4_ = 2;
    auVar88._24_4_ = 2;
    auVar88._28_4_ = 2;
    local_100 = vpermps_avx512vl(auVar88,ZEXT1632(auVar18));
    local_120 = vpermps_avx512vl(auVar88,ZEXT1632(auVar19));
    local_140 = vpermps_avx512vl(auVar88,ZEXT1632(auVar69));
    local_460 = vpermps_avx2(auVar88,ZEXT1632(auVar68));
    uVar170 = *(uint *)(ray + k * 4 + 0x30);
    local_370 = vpbroadcastd_avx512vl();
    auVar74 = auVar92._0_16_;
    if (bVar64 == 0) {
      bVar61 = false;
      auVar74 = vxorps_avx512vl(auVar74,auVar74);
      auVar181 = ZEXT1664(auVar74);
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar182 = ZEXT3264(auVar96);
      auVar183 = ZEXT3264(local_3e0);
      auVar184 = ZEXT3264(local_3c0);
      auVar180 = ZEXT3264(local_520);
      auVar179 = ZEXT3264(local_4e0);
      auVar185 = ZEXT3264(local_480);
      auVar186 = ZEXT3264(local_400);
    }
    else {
      local_420._0_16_ = ZEXT416(uVar170);
      local_3a0._0_16_ = auVar75;
      auVar92 = vmulps_avx512vl(local_460,auVar92);
      auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar92);
      auVar81 = vfmadd213ps_avx512vl(auVar81,local_120,auVar93);
      auVar92 = vfmadd213ps_avx512vl(auVar80,local_100,auVar81);
      auVar94 = vmulps_avx512vl(local_460,auVar94);
      auVar95 = vfmadd213ps_avx512vl(auVar95,local_140,auVar94);
      auVar81 = vfmadd213ps_avx512vl(auVar97,local_120,auVar95);
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x1210);
      auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x1694);
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x1b18);
      auVar80 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x1f9c);
      auVar88 = vfmadd213ps_avx512vl(auVar96,local_100,auVar81);
      auVar96 = vmulps_avx512vl(local_4a0,auVar80);
      auVar81 = vmulps_avx512vl(local_4c0,auVar80);
      auVar80 = vmulps_avx512vl(local_460,auVar80);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,local_480);
      auVar68 = vfmadd231ps_fma(auVar81,auVar94,local_400);
      auVar94 = vfmadd231ps_avx512vl(auVar80,local_140,auVar94);
      auVar76 = vfmadd231ps_fma(auVar96,auVar95,local_520);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),auVar95,local_4e0);
      auVar80 = vfmadd231ps_avx512vl(auVar94,local_120,auVar95);
      auVar81 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar97,local_3e0);
      auVar93 = vfmadd231ps_avx512vl(auVar96,auVar97,local_3c0);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x1210);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x1b18);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x1f9c);
      auVar80 = vfmadd231ps_avx512vl(auVar80,local_100,auVar97);
      auVar97 = vmulps_avx512vl(local_4a0,auVar94);
      auVar90 = vmulps_avx512vl(local_4c0,auVar94);
      auVar94 = vmulps_avx512vl(local_460,auVar94);
      auVar189 = ZEXT1664(auVar75);
      auVar91 = vfmadd231ps_avx512vl(auVar97,auVar95,local_480);
      auVar68 = vfmadd231ps_fma(auVar90,auVar95,local_400);
      auVar95 = vfmadd231ps_avx512vl(auVar94,local_140,auVar95);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x1694);
      auVar94 = vfmadd231ps_avx512vl(auVar91,auVar97,local_520);
      auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),auVar97,local_4e0);
      auVar97 = vfmadd231ps_avx512vl(auVar95,local_120,auVar97);
      auVar95 = vfmadd231ps_avx512vl(auVar94,auVar96,local_3e0);
      auVar94 = vfmadd231ps_avx512vl(auVar90,auVar96,local_3c0);
      auVar90 = vfmadd231ps_avx512vl(auVar97,local_100,auVar96);
      auVar177._8_4_ = 0x7fffffff;
      auVar177._0_8_ = 0x7fffffff7fffffff;
      auVar177._12_4_ = 0x7fffffff;
      auVar177._16_4_ = 0x7fffffff;
      auVar177._20_4_ = 0x7fffffff;
      auVar177._24_4_ = 0x7fffffff;
      auVar177._28_4_ = 0x7fffffff;
      auVar96 = vandps_avx(auVar81,auVar177);
      auVar97 = vandps_avx(auVar93,auVar177);
      auVar97 = vmaxps_avx(auVar96,auVar97);
      auVar96 = vandps_avx(auVar80,auVar177);
      auVar96 = vmaxps_avx(auVar97,auVar96);
      auVar80 = vbroadcastss_avx512vl(auVar75);
      uVar65 = vcmpps_avx512vl(auVar96,auVar80,1);
      bVar61 = (bool)((byte)uVar65 & 1);
      auVar91._0_4_ = (float)((uint)bVar61 * auVar86._0_4_ | (uint)!bVar61 * auVar81._0_4_);
      bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar91._4_4_ = (float)((uint)bVar61 * auVar86._4_4_ | (uint)!bVar61 * auVar81._4_4_);
      bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar91._8_4_ = (float)((uint)bVar61 * auVar86._8_4_ | (uint)!bVar61 * auVar81._8_4_);
      bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar91._12_4_ = (float)((uint)bVar61 * auVar86._12_4_ | (uint)!bVar61 * auVar81._12_4_);
      bVar61 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar91._16_4_ = (float)((uint)bVar61 * auVar86._16_4_ | (uint)!bVar61 * auVar81._16_4_);
      bVar61 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar91._20_4_ = (float)((uint)bVar61 * auVar86._20_4_ | (uint)!bVar61 * auVar81._20_4_);
      bVar61 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar91._24_4_ = (float)((uint)bVar61 * auVar86._24_4_ | (uint)!bVar61 * auVar81._24_4_);
      bVar61 = SUB81(uVar65 >> 7,0);
      auVar91._28_4_ = (uint)bVar61 * auVar86._28_4_ | (uint)!bVar61 * auVar81._28_4_;
      bVar61 = (bool)((byte)uVar65 & 1);
      auVar98._0_4_ = (float)((uint)bVar61 * auVar87._0_4_ | (uint)!bVar61 * auVar93._0_4_);
      bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar98._4_4_ = (float)((uint)bVar61 * auVar87._4_4_ | (uint)!bVar61 * auVar93._4_4_);
      bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar98._8_4_ = (float)((uint)bVar61 * auVar87._8_4_ | (uint)!bVar61 * auVar93._8_4_);
      bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar98._12_4_ = (float)((uint)bVar61 * auVar87._12_4_ | (uint)!bVar61 * auVar93._12_4_);
      bVar61 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar98._16_4_ = (float)((uint)bVar61 * auVar87._16_4_ | (uint)!bVar61 * auVar93._16_4_);
      bVar61 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar98._20_4_ = (float)((uint)bVar61 * auVar87._20_4_ | (uint)!bVar61 * auVar93._20_4_);
      bVar61 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar98._24_4_ = (float)((uint)bVar61 * auVar87._24_4_ | (uint)!bVar61 * auVar93._24_4_);
      bVar61 = SUB81(uVar65 >> 7,0);
      auVar98._28_4_ = (uint)bVar61 * auVar87._28_4_ | (uint)!bVar61 * auVar93._28_4_;
      auVar96 = vandps_avx(auVar177,auVar95);
      auVar97 = vandps_avx(auVar94,auVar177);
      auVar97 = vmaxps_avx(auVar96,auVar97);
      auVar96 = vandps_avx(auVar90,auVar177);
      auVar96 = vmaxps_avx(auVar97,auVar96);
      uVar65 = vcmpps_avx512vl(auVar96,auVar80,1);
      bVar61 = (bool)((byte)uVar65 & 1);
      auVar99._0_4_ = (float)((uint)bVar61 * auVar86._0_4_ | (uint)!bVar61 * auVar95._0_4_);
      bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar99._4_4_ = (float)((uint)bVar61 * auVar86._4_4_ | (uint)!bVar61 * auVar95._4_4_);
      bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar99._8_4_ = (float)((uint)bVar61 * auVar86._8_4_ | (uint)!bVar61 * auVar95._8_4_);
      bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar99._12_4_ = (float)((uint)bVar61 * auVar86._12_4_ | (uint)!bVar61 * auVar95._12_4_);
      bVar61 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar99._16_4_ = (float)((uint)bVar61 * auVar86._16_4_ | (uint)!bVar61 * auVar95._16_4_);
      bVar61 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar99._20_4_ = (float)((uint)bVar61 * auVar86._20_4_ | (uint)!bVar61 * auVar95._20_4_);
      bVar61 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar99._24_4_ = (float)((uint)bVar61 * auVar86._24_4_ | (uint)!bVar61 * auVar95._24_4_);
      bVar61 = SUB81(uVar65 >> 7,0);
      auVar99._28_4_ = (uint)bVar61 * auVar86._28_4_ | (uint)!bVar61 * auVar95._28_4_;
      bVar61 = (bool)((byte)uVar65 & 1);
      auVar86._0_4_ = (float)((uint)bVar61 * auVar87._0_4_ | (uint)!bVar61 * auVar94._0_4_);
      bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar86._4_4_ = (float)((uint)bVar61 * auVar87._4_4_ | (uint)!bVar61 * auVar94._4_4_);
      bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar86._8_4_ = (float)((uint)bVar61 * auVar87._8_4_ | (uint)!bVar61 * auVar94._8_4_);
      bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar86._12_4_ = (float)((uint)bVar61 * auVar87._12_4_ | (uint)!bVar61 * auVar94._12_4_);
      bVar61 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar86._16_4_ = (float)((uint)bVar61 * auVar87._16_4_ | (uint)!bVar61 * auVar94._16_4_);
      bVar61 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar86._20_4_ = (float)((uint)bVar61 * auVar87._20_4_ | (uint)!bVar61 * auVar94._20_4_);
      bVar61 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar86._24_4_ = (float)((uint)bVar61 * auVar87._24_4_ | (uint)!bVar61 * auVar94._24_4_);
      bVar61 = SUB81(uVar65 >> 7,0);
      auVar86._28_4_ = (uint)bVar61 * auVar87._28_4_ | (uint)!bVar61 * auVar94._28_4_;
      auVar77 = vxorps_avx512vl(auVar74,auVar74);
      auVar181 = ZEXT1664(auVar77);
      auVar96 = vfmadd213ps_avx512vl(auVar91,auVar91,ZEXT1632(auVar77));
      auVar74 = vfmadd231ps_fma(auVar96,auVar98,auVar98);
      auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar74));
      fVar142 = auVar95._0_4_;
      fVar132 = auVar95._4_4_;
      fVar133 = auVar95._8_4_;
      fVar134 = auVar95._12_4_;
      fVar161 = auVar95._16_4_;
      fVar164 = auVar95._20_4_;
      fVar66 = auVar95._24_4_;
      auVar96._4_4_ = fVar132 * fVar132 * fVar132 * auVar74._4_4_ * -0.5;
      auVar96._0_4_ = fVar142 * fVar142 * fVar142 * auVar74._0_4_ * -0.5;
      auVar96._8_4_ = fVar133 * fVar133 * fVar133 * auVar74._8_4_ * -0.5;
      auVar96._12_4_ = fVar134 * fVar134 * fVar134 * auVar74._12_4_ * -0.5;
      auVar96._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
      auVar96._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
      auVar96._24_4_ = fVar66 * fVar66 * fVar66 * -0.0;
      auVar96._28_4_ = 0;
      auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar80,auVar95);
      auVar97._4_4_ = auVar98._4_4_ * auVar96._4_4_;
      auVar97._0_4_ = auVar98._0_4_ * auVar96._0_4_;
      auVar97._8_4_ = auVar98._8_4_ * auVar96._8_4_;
      auVar97._12_4_ = auVar98._12_4_ * auVar96._12_4_;
      auVar97._16_4_ = auVar98._16_4_ * auVar96._16_4_;
      auVar97._20_4_ = auVar98._20_4_ * auVar96._20_4_;
      auVar97._24_4_ = auVar98._24_4_ * auVar96._24_4_;
      auVar97._28_4_ = auVar95._28_4_;
      auVar95._4_4_ = auVar96._4_4_ * -auVar91._4_4_;
      auVar95._0_4_ = auVar96._0_4_ * -auVar91._0_4_;
      auVar95._8_4_ = auVar96._8_4_ * -auVar91._8_4_;
      auVar95._12_4_ = auVar96._12_4_ * -auVar91._12_4_;
      auVar95._16_4_ = auVar96._16_4_ * -auVar91._16_4_;
      auVar95._20_4_ = auVar96._20_4_ * -auVar91._20_4_;
      auVar95._24_4_ = auVar96._24_4_ * -auVar91._24_4_;
      auVar95._28_4_ = auVar91._28_4_ ^ 0x80000000;
      auVar87 = vmulps_avx512vl(auVar96,ZEXT1632(auVar77));
      auVar90 = ZEXT1632(auVar77);
      auVar94 = vfmadd213ps_avx512vl(auVar99,auVar99,auVar90);
      auVar74 = vfmadd231ps_fma(auVar94,auVar86,auVar86);
      auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar74));
      fVar142 = auVar93._0_4_;
      fVar132 = auVar93._4_4_;
      fVar133 = auVar93._8_4_;
      fVar134 = auVar93._12_4_;
      fVar161 = auVar93._16_4_;
      fVar164 = auVar93._20_4_;
      fVar66 = auVar93._24_4_;
      auVar94._4_4_ = fVar132 * fVar132 * fVar132 * auVar74._4_4_ * -0.5;
      auVar94._0_4_ = fVar142 * fVar142 * fVar142 * auVar74._0_4_ * -0.5;
      auVar94._8_4_ = fVar133 * fVar133 * fVar133 * auVar74._8_4_ * -0.5;
      auVar94._12_4_ = fVar134 * fVar134 * fVar134 * auVar74._12_4_ * -0.5;
      auVar94._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
      auVar94._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
      auVar94._24_4_ = fVar66 * fVar66 * fVar66 * -0.0;
      auVar94._28_4_ = 0;
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar80,auVar93);
      auVar81._4_4_ = auVar86._4_4_ * auVar94._4_4_;
      auVar81._0_4_ = auVar86._0_4_ * auVar94._0_4_;
      auVar81._8_4_ = auVar86._8_4_ * auVar94._8_4_;
      auVar81._12_4_ = auVar86._12_4_ * auVar94._12_4_;
      auVar81._16_4_ = auVar86._16_4_ * auVar94._16_4_;
      auVar81._20_4_ = auVar86._20_4_ * auVar94._20_4_;
      auVar81._24_4_ = auVar86._24_4_ * auVar94._24_4_;
      auVar81._28_4_ = auVar93._28_4_;
      auVar93._4_4_ = -auVar99._4_4_ * auVar94._4_4_;
      auVar93._0_4_ = -auVar99._0_4_ * auVar94._0_4_;
      auVar93._8_4_ = -auVar99._8_4_ * auVar94._8_4_;
      auVar93._12_4_ = -auVar99._12_4_ * auVar94._12_4_;
      auVar93._16_4_ = -auVar99._16_4_ * auVar94._16_4_;
      auVar93._20_4_ = -auVar99._20_4_ * auVar94._20_4_;
      auVar93._24_4_ = -auVar99._24_4_ * auVar94._24_4_;
      auVar93._28_4_ = auVar96._28_4_;
      auVar96 = vmulps_avx512vl(auVar94,auVar90);
      auVar74 = vfmadd213ps_fma(auVar97,auVar89,auVar82);
      auVar68 = vfmadd213ps_fma(auVar95,auVar89,auVar83);
      auVar94 = vfmadd213ps_avx512vl(auVar87,auVar89,auVar88);
      auVar80 = vfmadd213ps_avx512vl(auVar81,ZEXT1632(auVar17),auVar84);
      auVar70 = vfnmadd213ps_fma(auVar97,auVar89,auVar82);
      auVar82 = ZEXT1632(auVar17);
      auVar76 = vfmadd213ps_fma(auVar93,auVar82,auVar85);
      auVar20 = vfnmadd213ps_fma(auVar95,auVar89,auVar83);
      auVar69 = vfmadd213ps_fma(auVar96,auVar82,auVar92);
      auVar97 = vfnmadd231ps_avx512vl(auVar88,auVar89,auVar87);
      auVar71 = vfnmadd213ps_fma(auVar81,auVar82,auVar84);
      auVar73 = vfnmadd213ps_fma(auVar93,auVar82,auVar85);
      auVar72 = vfnmadd231ps_fma(auVar92,ZEXT1632(auVar17),auVar96);
      auVar95 = vsubps_avx512vl(auVar80,ZEXT1632(auVar70));
      auVar96 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar20));
      auVar81 = vsubps_avx512vl(ZEXT1632(auVar69),auVar97);
      auVar93 = vmulps_avx512vl(auVar96,auVar97);
      auVar18 = vfmsub231ps_fma(auVar93,ZEXT1632(auVar20),auVar81);
      auVar92._4_4_ = auVar70._4_4_ * auVar81._4_4_;
      auVar92._0_4_ = auVar70._0_4_ * auVar81._0_4_;
      auVar92._8_4_ = auVar70._8_4_ * auVar81._8_4_;
      auVar92._12_4_ = auVar70._12_4_ * auVar81._12_4_;
      auVar92._16_4_ = auVar81._16_4_ * 0.0;
      auVar92._20_4_ = auVar81._20_4_ * 0.0;
      auVar92._24_4_ = auVar81._24_4_ * 0.0;
      auVar92._28_4_ = auVar81._28_4_;
      auVar81 = vfmsub231ps_avx512vl(auVar92,auVar97,auVar95);
      auVar82._4_4_ = auVar20._4_4_ * auVar95._4_4_;
      auVar82._0_4_ = auVar20._0_4_ * auVar95._0_4_;
      auVar82._8_4_ = auVar20._8_4_ * auVar95._8_4_;
      auVar82._12_4_ = auVar20._12_4_ * auVar95._12_4_;
      auVar82._16_4_ = auVar95._16_4_ * 0.0;
      auVar82._20_4_ = auVar95._20_4_ * 0.0;
      auVar82._24_4_ = auVar95._24_4_ * 0.0;
      auVar82._28_4_ = auVar95._28_4_;
      auVar19 = vfmsub231ps_fma(auVar82,ZEXT1632(auVar70),auVar96);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar19),auVar90,auVar81);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar18));
      auVar86 = ZEXT1632(auVar77);
      uVar65 = vcmpps_avx512vl(auVar96,auVar86,2);
      bVar57 = (byte)uVar65;
      fVar66 = (float)((uint)(bVar57 & 1) * auVar74._0_4_ |
                      (uint)!(bool)(bVar57 & 1) * auVar71._0_4_);
      bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
      fVar116 = (float)((uint)bVar61 * auVar74._4_4_ | (uint)!bVar61 * auVar71._4_4_);
      bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
      fVar118 = (float)((uint)bVar61 * auVar74._8_4_ | (uint)!bVar61 * auVar71._8_4_);
      bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
      fVar121 = (float)((uint)bVar61 * auVar74._12_4_ | (uint)!bVar61 * auVar71._12_4_);
      auVar93 = ZEXT1632(CONCAT412(fVar121,CONCAT48(fVar118,CONCAT44(fVar116,fVar66))));
      fVar67 = (float)((uint)(bVar57 & 1) * auVar68._0_4_ |
                      (uint)!(bool)(bVar57 & 1) * auVar73._0_4_);
      bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
      fVar117 = (float)((uint)bVar61 * auVar68._4_4_ | (uint)!bVar61 * auVar73._4_4_);
      bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
      fVar119 = (float)((uint)bVar61 * auVar68._8_4_ | (uint)!bVar61 * auVar73._8_4_);
      bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
      fVar122 = (float)((uint)bVar61 * auVar68._12_4_ | (uint)!bVar61 * auVar73._12_4_);
      auVar92 = ZEXT1632(CONCAT412(fVar122,CONCAT48(fVar119,CONCAT44(fVar117,fVar67))));
      auVar87._0_4_ =
           (float)((uint)(bVar57 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar72._0_4_);
      bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar87._4_4_ = (float)((uint)bVar61 * auVar94._4_4_ | (uint)!bVar61 * auVar72._4_4_);
      bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar87._8_4_ = (float)((uint)bVar61 * auVar94._8_4_ | (uint)!bVar61 * auVar72._8_4_);
      bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar87._12_4_ = (float)((uint)bVar61 * auVar94._12_4_ | (uint)!bVar61 * auVar72._12_4_);
      fVar142 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar94._16_4_);
      auVar87._16_4_ = fVar142;
      fVar132 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar94._20_4_);
      auVar87._20_4_ = fVar132;
      fVar133 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar94._24_4_);
      auVar87._24_4_ = fVar133;
      iVar1 = (uint)(byte)(uVar65 >> 7) * auVar94._28_4_;
      auVar87._28_4_ = iVar1;
      auVar95 = vblendmps_avx512vl(ZEXT1632(auVar70),auVar80);
      auVar100._0_4_ =
           (uint)(bVar57 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar68._0_4_;
      bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar100._4_4_ = (uint)bVar61 * auVar95._4_4_ | (uint)!bVar61 * auVar68._4_4_;
      bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar100._8_4_ = (uint)bVar61 * auVar95._8_4_ | (uint)!bVar61 * auVar68._8_4_;
      bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar100._12_4_ = (uint)bVar61 * auVar95._12_4_ | (uint)!bVar61 * auVar68._12_4_;
      auVar100._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * auVar95._16_4_;
      auVar100._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * auVar95._20_4_;
      auVar100._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * auVar95._24_4_;
      auVar100._28_4_ = (uint)(byte)(uVar65 >> 7) * auVar95._28_4_;
      auVar95 = vblendmps_avx512vl(ZEXT1632(auVar20),ZEXT1632(auVar76));
      auVar101._0_4_ =
           (float)((uint)(bVar57 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar18._0_4_);
      bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar101._4_4_ = (float)((uint)bVar61 * auVar95._4_4_ | (uint)!bVar61 * auVar18._4_4_);
      bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar101._8_4_ = (float)((uint)bVar61 * auVar95._8_4_ | (uint)!bVar61 * auVar18._8_4_);
      bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar101._12_4_ = (float)((uint)bVar61 * auVar95._12_4_ | (uint)!bVar61 * auVar18._12_4_);
      fVar134 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar95._16_4_);
      auVar101._16_4_ = fVar134;
      fVar161 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar95._20_4_);
      auVar101._20_4_ = fVar161;
      fVar164 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar95._24_4_);
      auVar101._24_4_ = fVar164;
      auVar101._28_4_ = (uint)(byte)(uVar65 >> 7) * auVar95._28_4_;
      auVar95 = vblendmps_avx512vl(auVar97,ZEXT1632(auVar69));
      auVar102._0_4_ =
           (float)((uint)(bVar57 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar94._0_4_);
      bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar102._4_4_ = (float)((uint)bVar61 * auVar95._4_4_ | (uint)!bVar61 * auVar94._4_4_);
      bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar102._8_4_ = (float)((uint)bVar61 * auVar95._8_4_ | (uint)!bVar61 * auVar94._8_4_);
      bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar102._12_4_ = (float)((uint)bVar61 * auVar95._12_4_ | (uint)!bVar61 * auVar94._12_4_);
      bVar61 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar102._16_4_ = (float)((uint)bVar61 * auVar95._16_4_ | (uint)!bVar61 * auVar94._16_4_);
      bVar61 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar102._20_4_ = (float)((uint)bVar61 * auVar95._20_4_ | (uint)!bVar61 * auVar94._20_4_);
      bVar61 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar102._24_4_ = (float)((uint)bVar61 * auVar95._24_4_ | (uint)!bVar61 * auVar94._24_4_);
      bVar61 = SUB81(uVar65 >> 7,0);
      auVar102._28_4_ = (uint)bVar61 * auVar95._28_4_ | (uint)!bVar61 * auVar94._28_4_;
      auVar103._0_4_ =
           (uint)(bVar57 & 1) * (int)auVar70._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar80._0_4_;
      bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar103._4_4_ = (uint)bVar61 * (int)auVar70._4_4_ | (uint)!bVar61 * auVar80._4_4_;
      bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar103._8_4_ = (uint)bVar61 * (int)auVar70._8_4_ | (uint)!bVar61 * auVar80._8_4_;
      bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar103._12_4_ = (uint)bVar61 * (int)auVar70._12_4_ | (uint)!bVar61 * auVar80._12_4_;
      auVar103._16_4_ = (uint)!(bool)((byte)(uVar65 >> 4) & 1) * auVar80._16_4_;
      auVar103._20_4_ = (uint)!(bool)((byte)(uVar65 >> 5) & 1) * auVar80._20_4_;
      auVar103._24_4_ = (uint)!(bool)((byte)(uVar65 >> 6) & 1) * auVar80._24_4_;
      auVar103._28_4_ = (uint)!SUB81(uVar65 >> 7,0) * auVar80._28_4_;
      bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar104._0_4_ =
           (uint)(bVar57 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar69._0_4_;
      bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar104._4_4_ = (uint)bVar11 * auVar97._4_4_ | (uint)!bVar11 * auVar69._4_4_;
      bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar104._8_4_ = (uint)bVar11 * auVar97._8_4_ | (uint)!bVar11 * auVar69._8_4_;
      bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar104._12_4_ = (uint)bVar11 * auVar97._12_4_ | (uint)!bVar11 * auVar69._12_4_;
      auVar104._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * auVar97._16_4_;
      auVar104._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * auVar97._20_4_;
      auVar104._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * auVar97._24_4_;
      iVar2 = (uint)(byte)(uVar65 >> 7) * auVar97._28_4_;
      auVar104._28_4_ = iVar2;
      auVar82 = vsubps_avx512vl(auVar103,auVar93);
      auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar20._12_4_ |
                                              (uint)!bVar14 * auVar76._12_4_,
                                              CONCAT48((uint)bVar12 * (int)auVar20._8_4_ |
                                                       (uint)!bVar12 * auVar76._8_4_,
                                                       CONCAT44((uint)bVar61 * (int)auVar20._4_4_ |
                                                                (uint)!bVar61 * auVar76._4_4_,
                                                                (uint)(bVar57 & 1) *
                                                                (int)auVar20._0_4_ |
                                                                (uint)!(bool)(bVar57 & 1) *
                                                                auVar76._0_4_)))),auVar92);
      auVar95 = vsubps_avx(auVar104,auVar87);
      auVar94 = vsubps_avx(auVar93,auVar100);
      auVar80 = vsubps_avx(auVar92,auVar101);
      auVar81 = vsubps_avx(auVar87,auVar102);
      auVar83._4_4_ = auVar95._4_4_ * fVar116;
      auVar83._0_4_ = auVar95._0_4_ * fVar66;
      auVar83._8_4_ = auVar95._8_4_ * fVar118;
      auVar83._12_4_ = auVar95._12_4_ * fVar121;
      auVar83._16_4_ = auVar95._16_4_ * 0.0;
      auVar83._20_4_ = auVar95._20_4_ * 0.0;
      auVar83._24_4_ = auVar95._24_4_ * 0.0;
      auVar83._28_4_ = iVar2;
      auVar74 = vfmsub231ps_fma(auVar83,auVar87,auVar82);
      auVar84._4_4_ = fVar117 * auVar82._4_4_;
      auVar84._0_4_ = fVar67 * auVar82._0_4_;
      auVar84._8_4_ = fVar119 * auVar82._8_4_;
      auVar84._12_4_ = fVar122 * auVar82._12_4_;
      auVar84._16_4_ = auVar82._16_4_ * 0.0;
      auVar84._20_4_ = auVar82._20_4_ * 0.0;
      auVar84._24_4_ = auVar82._24_4_ * 0.0;
      auVar84._28_4_ = auVar96._28_4_;
      auVar68 = vfmsub231ps_fma(auVar84,auVar93,auVar97);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),auVar86,ZEXT1632(auVar74));
      auVar153._0_4_ = auVar97._0_4_ * auVar87._0_4_;
      auVar153._4_4_ = auVar97._4_4_ * auVar87._4_4_;
      auVar153._8_4_ = auVar97._8_4_ * auVar87._8_4_;
      auVar153._12_4_ = auVar97._12_4_ * auVar87._12_4_;
      auVar153._16_4_ = auVar97._16_4_ * fVar142;
      auVar153._20_4_ = auVar97._20_4_ * fVar132;
      auVar153._24_4_ = auVar97._24_4_ * fVar133;
      auVar153._28_4_ = 0;
      auVar74 = vfmsub231ps_fma(auVar153,auVar92,auVar95);
      auVar83 = vfmadd231ps_avx512vl(auVar96,auVar86,ZEXT1632(auVar74));
      auVar96 = vmulps_avx512vl(auVar81,auVar100);
      auVar96 = vfmsub231ps_avx512vl(auVar96,auVar94,auVar102);
      auVar85._4_4_ = auVar80._4_4_ * auVar102._4_4_;
      auVar85._0_4_ = auVar80._0_4_ * auVar102._0_4_;
      auVar85._8_4_ = auVar80._8_4_ * auVar102._8_4_;
      auVar85._12_4_ = auVar80._12_4_ * auVar102._12_4_;
      auVar85._16_4_ = auVar80._16_4_ * auVar102._16_4_;
      auVar85._20_4_ = auVar80._20_4_ * auVar102._20_4_;
      auVar85._24_4_ = auVar80._24_4_ * auVar102._24_4_;
      auVar85._28_4_ = auVar102._28_4_;
      auVar74 = vfmsub231ps_fma(auVar85,auVar101,auVar81);
      auVar154._0_4_ = auVar101._0_4_ * auVar94._0_4_;
      auVar154._4_4_ = auVar101._4_4_ * auVar94._4_4_;
      auVar154._8_4_ = auVar101._8_4_ * auVar94._8_4_;
      auVar154._12_4_ = auVar101._12_4_ * auVar94._12_4_;
      auVar154._16_4_ = fVar134 * auVar94._16_4_;
      auVar154._20_4_ = fVar161 * auVar94._20_4_;
      auVar154._24_4_ = fVar164 * auVar94._24_4_;
      auVar154._28_4_ = 0;
      auVar68 = vfmsub231ps_fma(auVar154,auVar80,auVar100);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),auVar86,auVar96);
      auVar84 = vfmadd231ps_avx512vl(auVar96,auVar86,ZEXT1632(auVar74));
      auVar96 = vmaxps_avx(auVar83,auVar84);
      uVar135 = vcmpps_avx512vl(auVar96,auVar86,2);
      bVar64 = bVar64 & (byte)uVar135;
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar182 = ZEXT3264(auVar85);
      auVar183 = ZEXT3264(local_3e0);
      auVar184 = ZEXT3264(local_3c0);
      auVar180 = ZEXT3264(local_520);
      auVar179 = ZEXT3264(local_4e0);
      auVar186 = ZEXT3264(local_400);
      if (bVar64 == 0) {
        bVar61 = false;
        auVar185 = ZEXT3264(local_480);
        auVar187 = ZEXT3264(local_4a0);
        auVar188 = ZEXT3264(local_4c0);
      }
      else {
        auVar28._4_4_ = auVar81._4_4_ * auVar97._4_4_;
        auVar28._0_4_ = auVar81._0_4_ * auVar97._0_4_;
        auVar28._8_4_ = auVar81._8_4_ * auVar97._8_4_;
        auVar28._12_4_ = auVar81._12_4_ * auVar97._12_4_;
        auVar28._16_4_ = auVar81._16_4_ * auVar97._16_4_;
        auVar28._20_4_ = auVar81._20_4_ * auVar97._20_4_;
        auVar28._24_4_ = auVar81._24_4_ * auVar97._24_4_;
        auVar28._28_4_ = auVar96._28_4_;
        auVar76 = vfmsub231ps_fma(auVar28,auVar80,auVar95);
        auVar29._4_4_ = auVar95._4_4_ * auVar94._4_4_;
        auVar29._0_4_ = auVar95._0_4_ * auVar94._0_4_;
        auVar29._8_4_ = auVar95._8_4_ * auVar94._8_4_;
        auVar29._12_4_ = auVar95._12_4_ * auVar94._12_4_;
        auVar29._16_4_ = auVar95._16_4_ * auVar94._16_4_;
        auVar29._20_4_ = auVar95._20_4_ * auVar94._20_4_;
        auVar29._24_4_ = auVar95._24_4_ * auVar94._24_4_;
        auVar29._28_4_ = auVar95._28_4_;
        auVar68 = vfmsub231ps_fma(auVar29,auVar82,auVar81);
        auVar30._4_4_ = auVar80._4_4_ * auVar82._4_4_;
        auVar30._0_4_ = auVar80._0_4_ * auVar82._0_4_;
        auVar30._8_4_ = auVar80._8_4_ * auVar82._8_4_;
        auVar30._12_4_ = auVar80._12_4_ * auVar82._12_4_;
        auVar30._16_4_ = auVar80._16_4_ * auVar82._16_4_;
        auVar30._20_4_ = auVar80._20_4_ * auVar82._20_4_;
        auVar30._24_4_ = auVar80._24_4_ * auVar82._24_4_;
        auVar30._28_4_ = auVar80._28_4_;
        auVar69 = vfmsub231ps_fma(auVar30,auVar94,auVar97);
        auVar74 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar68),ZEXT1632(auVar69));
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar76),auVar86);
        auVar97 = vrcp14ps_avx512vl(auVar96);
        auVar95 = vfnmadd213ps_avx512vl(auVar97,auVar96,auVar85);
        auVar74 = vfmadd132ps_fma(auVar95,auVar97,auVar97);
        auVar31._4_4_ = auVar69._4_4_ * auVar87._4_4_;
        auVar31._0_4_ = auVar69._0_4_ * auVar87._0_4_;
        auVar31._8_4_ = auVar69._8_4_ * auVar87._8_4_;
        auVar31._12_4_ = auVar69._12_4_ * auVar87._12_4_;
        auVar31._16_4_ = fVar142 * 0.0;
        auVar31._20_4_ = fVar132 * 0.0;
        auVar31._24_4_ = fVar133 * 0.0;
        auVar31._28_4_ = iVar1;
        auVar68 = vfmadd231ps_fma(auVar31,auVar92,ZEXT1632(auVar68));
        auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar93,ZEXT1632(auVar76));
        fVar142 = auVar74._0_4_;
        fVar132 = auVar74._4_4_;
        fVar133 = auVar74._8_4_;
        fVar134 = auVar74._12_4_;
        local_220 = ZEXT1632(CONCAT412(auVar68._12_4_ * fVar134,
                                       CONCAT48(auVar68._8_4_ * fVar133,
                                                CONCAT44(auVar68._4_4_ * fVar132,
                                                         auVar68._0_4_ * fVar142))));
        auVar167._4_4_ = uVar170;
        auVar167._0_4_ = uVar170;
        auVar167._8_4_ = uVar170;
        auVar167._12_4_ = uVar170;
        auVar167._16_4_ = uVar170;
        auVar167._20_4_ = uVar170;
        auVar167._24_4_ = uVar170;
        auVar167._28_4_ = uVar170;
        uVar135 = vcmpps_avx512vl(auVar167,local_220,2);
        uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar23._4_4_ = uVar125;
        auVar23._0_4_ = uVar125;
        auVar23._8_4_ = uVar125;
        auVar23._12_4_ = uVar125;
        auVar23._16_4_ = uVar125;
        auVar23._20_4_ = uVar125;
        auVar23._24_4_ = uVar125;
        auVar23._28_4_ = uVar125;
        uVar21 = vcmpps_avx512vl(local_220,auVar23,2);
        bVar64 = (byte)uVar135 & (byte)uVar21 & bVar64;
        auVar185 = ZEXT3264(local_480);
        auVar187 = ZEXT3264(local_4a0);
        auVar188 = ZEXT3264(local_4c0);
        if (bVar64 != 0) {
          uVar135 = vcmpps_avx512vl(auVar96,auVar86,4);
          bVar64 = bVar64 & (byte)uVar135;
          auVar168 = ZEXT1664(local_590);
          if (bVar64 != 0) {
            fVar161 = auVar83._0_4_ * fVar142;
            fVar164 = auVar83._4_4_ * fVar132;
            auVar32._4_4_ = fVar164;
            auVar32._0_4_ = fVar161;
            fVar66 = auVar83._8_4_ * fVar133;
            auVar32._8_4_ = fVar66;
            fVar67 = auVar83._12_4_ * fVar134;
            auVar32._12_4_ = fVar67;
            fVar116 = auVar83._16_4_ * 0.0;
            auVar32._16_4_ = fVar116;
            fVar117 = auVar83._20_4_ * 0.0;
            auVar32._20_4_ = fVar117;
            fVar118 = auVar83._24_4_ * 0.0;
            auVar32._24_4_ = fVar118;
            auVar32._28_4_ = auVar96._28_4_;
            auVar97 = vsubps_avx512vl(auVar85,auVar32);
            local_260._0_4_ =
                 (float)((uint)(bVar57 & 1) * (int)fVar161 |
                        (uint)!(bool)(bVar57 & 1) * auVar97._0_4_);
            bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
            local_260._4_4_ = (float)((uint)bVar61 * (int)fVar164 | (uint)!bVar61 * auVar97._4_4_);
            bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
            local_260._8_4_ = (float)((uint)bVar61 * (int)fVar66 | (uint)!bVar61 * auVar97._8_4_);
            bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
            local_260._12_4_ = (float)((uint)bVar61 * (int)fVar67 | (uint)!bVar61 * auVar97._12_4_);
            bVar61 = (bool)((byte)(uVar65 >> 4) & 1);
            local_260._16_4_ = (float)((uint)bVar61 * (int)fVar116 | (uint)!bVar61 * auVar97._16_4_)
            ;
            bVar61 = (bool)((byte)(uVar65 >> 5) & 1);
            local_260._20_4_ = (float)((uint)bVar61 * (int)fVar117 | (uint)!bVar61 * auVar97._20_4_)
            ;
            bVar61 = (bool)((byte)(uVar65 >> 6) & 1);
            local_260._24_4_ = (float)((uint)bVar61 * (int)fVar118 | (uint)!bVar61 * auVar97._24_4_)
            ;
            bVar61 = SUB81(uVar65 >> 7,0);
            local_260._28_4_ =
                 (float)((uint)bVar61 * auVar96._28_4_ | (uint)!bVar61 * auVar97._28_4_);
            auVar96 = vsubps_avx(ZEXT1632(auVar17),auVar89);
            auVar74 = vfmadd213ps_fma(auVar96,local_260,auVar89);
            uVar125 = *(undefined4 *)((long)local_558->ray_space + k * 4 + -0x10);
            auVar89._4_4_ = uVar125;
            auVar89._0_4_ = uVar125;
            auVar89._8_4_ = uVar125;
            auVar89._12_4_ = uVar125;
            auVar89._16_4_ = uVar125;
            auVar89._20_4_ = uVar125;
            auVar89._24_4_ = uVar125;
            auVar89._28_4_ = uVar125;
            auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar74._12_4_ + auVar74._12_4_,
                                                         CONCAT48(auVar74._8_4_ + auVar74._8_4_,
                                                                  CONCAT44(auVar74._4_4_ +
                                                                           auVar74._4_4_,
                                                                           auVar74._0_4_ +
                                                                           auVar74._0_4_)))),auVar89
                                     );
            uVar135 = vcmpps_avx512vl(local_220,auVar96,6);
            if (((byte)uVar135 & bVar64) != 0) {
              auVar141._0_4_ = auVar84._0_4_ * fVar142;
              auVar141._4_4_ = auVar84._4_4_ * fVar132;
              auVar141._8_4_ = auVar84._8_4_ * fVar133;
              auVar141._12_4_ = auVar84._12_4_ * fVar134;
              auVar141._16_4_ = auVar84._16_4_ * 0.0;
              auVar141._20_4_ = auVar84._20_4_ * 0.0;
              auVar141._24_4_ = auVar84._24_4_ * 0.0;
              auVar141._28_4_ = 0;
              auVar96 = vsubps_avx512vl(auVar85,auVar141);
              auVar105._0_4_ =
                   (uint)(bVar57 & 1) * (int)auVar141._0_4_ |
                   (uint)!(bool)(bVar57 & 1) * auVar96._0_4_;
              bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar105._4_4_ = (uint)bVar61 * (int)auVar141._4_4_ | (uint)!bVar61 * auVar96._4_4_;
              bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar105._8_4_ = (uint)bVar61 * (int)auVar141._8_4_ | (uint)!bVar61 * auVar96._8_4_;
              bVar61 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar105._12_4_ = (uint)bVar61 * (int)auVar141._12_4_ | (uint)!bVar61 * auVar96._12_4_
              ;
              bVar61 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar105._16_4_ = (uint)bVar61 * (int)auVar141._16_4_ | (uint)!bVar61 * auVar96._16_4_
              ;
              bVar61 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar105._20_4_ = (uint)bVar61 * (int)auVar141._20_4_ | (uint)!bVar61 * auVar96._20_4_
              ;
              bVar61 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar105._24_4_ = (uint)bVar61 * (int)auVar141._24_4_ | (uint)!bVar61 * auVar96._24_4_
              ;
              auVar105._28_4_ = (uint)!SUB81(uVar65 >> 7,0) * auVar96._28_4_;
              auVar24._8_4_ = 0x40000000;
              auVar24._0_8_ = 0x4000000040000000;
              auVar24._12_4_ = 0x40000000;
              auVar24._16_4_ = 0x40000000;
              auVar24._20_4_ = 0x40000000;
              auVar24._24_4_ = 0x40000000;
              auVar24._28_4_ = 0x40000000;
              local_240 = vfmsub132ps_avx512vl(auVar105,auVar85,auVar24);
              local_200 = 0;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar61 = true, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_0183a081;
                fVar142 = 1.0 / (float)local_4f0._0_4_;
                local_1a0[0] = fVar142 * (local_260._0_4_ + 0.0);
                local_1a0[1] = fVar142 * (local_260._4_4_ + 1.0);
                local_1a0[2] = fVar142 * (local_260._8_4_ + 2.0);
                local_1a0[3] = fVar142 * (local_260._12_4_ + 3.0);
                fStack_190 = fVar142 * (local_260._16_4_ + 4.0);
                fStack_18c = fVar142 * (local_260._20_4_ + 5.0);
                fStack_188 = fVar142 * (local_260._24_4_ + 6.0);
                fStack_184 = local_260._28_4_ + 7.0;
                local_180 = local_240;
                local_160 = local_220;
                lVar58 = 0;
                local_360 = (ulong)((byte)uVar135 & bVar64);
                for (uVar65 = local_360; (uVar65 & 1) == 0;
                    uVar65 = uVar65 >> 1 | 0x8000000000000000) {
                  lVar58 = lVar58 + 1;
                }
                local_500 = vpbroadcastd_avx512vl();
                local_1fc = iVar8;
                local_1f0 = local_590;
                local_1e0 = local_570;
                uStack_1d8 = uStack_568;
                local_1d0 = local_580;
                uStack_1c8 = uStack_578;
                while( true ) {
                  auVar75 = auVar189._0_16_;
                  auVar74 = auVar181._0_16_;
                  if (local_360 == 0) break;
                  uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_300 = local_1a0[lVar58];
                  local_2a0 = (uint)lVar58;
                  uStack_29c = (uint)((ulong)lVar58 >> 0x20);
                  local_2f0 = *(undefined4 *)(local_180 + lVar58 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + lVar58 * 4);
                  local_550.context = context->user;
                  fVar132 = 1.0 - local_300;
                  fVar142 = fVar132 * fVar132 * -3.0;
                  auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * fVar132)),
                                            ZEXT416((uint)(local_300 * fVar132)),ZEXT416(0xc0000000)
                                           );
                  auVar68 = vfmsub132ss_fma(ZEXT416((uint)(local_300 * fVar132)),
                                            ZEXT416((uint)(local_300 * local_300)),
                                            ZEXT416(0x40000000));
                  fVar132 = auVar75._0_4_ * 3.0;
                  fVar133 = auVar68._0_4_ * 3.0;
                  fVar134 = local_300 * local_300 * 3.0;
                  auVar159._0_4_ = fVar134 * local_440;
                  auVar159._4_4_ = fVar134 * fStack_43c;
                  auVar159._8_4_ = fVar134 * fStack_438;
                  auVar159._12_4_ = fVar134 * fStack_434;
                  auVar128._4_4_ = fVar133;
                  auVar128._0_4_ = fVar133;
                  auVar128._8_4_ = fVar133;
                  auVar128._12_4_ = fVar133;
                  auVar51._8_8_ = uStack_578;
                  auVar51._0_8_ = local_580;
                  auVar75 = vfmadd132ps_fma(auVar128,auVar159,auVar51);
                  auVar148._4_4_ = fVar132;
                  auVar148._0_4_ = fVar132;
                  auVar148._8_4_ = fVar132;
                  auVar148._12_4_ = fVar132;
                  auVar53._8_8_ = uStack_568;
                  auVar53._0_8_ = local_570;
                  auVar75 = vfmadd132ps_fma(auVar148,auVar75,auVar53);
                  auVar129._4_4_ = fVar142;
                  auVar129._0_4_ = fVar142;
                  auVar129._8_4_ = fVar142;
                  auVar129._12_4_ = fVar142;
                  auVar75 = vfmadd213ps_fma(auVar129,auVar168._0_16_,auVar75);
                  local_330 = auVar75._0_4_;
                  local_320 = vshufps_avx(auVar75,auVar75,0x55);
                  local_310 = vshufps_avx(auVar75,auVar75,0xaa);
                  local_2e0 = local_370._0_8_;
                  uStack_2d8 = local_370._8_8_;
                  local_2d0 = local_500;
                  vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                  uStack_2bc = (local_550.context)->instID[0];
                  local_2c0 = uStack_2bc;
                  uStack_2b8 = uStack_2bc;
                  uStack_2b4 = uStack_2bc;
                  uStack_2b0 = (local_550.context)->instPrimID[0];
                  uStack_2ac = uStack_2b0;
                  uStack_2a8 = uStack_2b0;
                  uStack_2a4 = uStack_2b0;
                  local_5b0 = local_380;
                  local_550.valid = (int *)local_5b0;
                  local_550.geometryUserPtr = pGVar9->userPtr;
                  local_550.hit = (RTCHitN *)&local_330;
                  local_550.N = 4;
                  local_550.ray = (RTCRayN *)ray;
                  uStack_32c = local_330;
                  uStack_328 = local_330;
                  uStack_324 = local_330;
                  fStack_2fc = local_300;
                  fStack_2f8 = local_300;
                  fStack_2f4 = local_300;
                  uStack_2ec = local_2f0;
                  uStack_2e8 = local_2f0;
                  uStack_2e4 = local_2f0;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->occlusionFilterN)(&local_550);
                    auVar189 = ZEXT1664(local_3a0._0_16_);
                    auVar188 = ZEXT3264(local_4c0);
                    auVar187 = ZEXT3264(local_4a0);
                    auVar186 = ZEXT3264(local_400);
                    auVar185 = ZEXT3264(local_480);
                    auVar179 = ZEXT3264(local_4e0);
                    auVar180 = ZEXT3264(local_520);
                    auVar184 = ZEXT3264(local_3c0);
                    auVar183 = ZEXT3264(local_3e0);
                    auVar168 = ZEXT1664(local_590);
                    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar182 = ZEXT3264(auVar96);
                    auVar75 = vxorps_avx512vl(auVar74,auVar74);
                    auVar181 = ZEXT1664(auVar75);
                    uVar170 = local_420._0_4_;
                  }
                  auVar75 = auVar181._0_16_;
                  uVar65 = vptestmd_avx512vl(local_5b0,local_5b0);
                  if ((uVar65 & 0xf) != 0) {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_550);
                      auVar189 = ZEXT1664(local_3a0._0_16_);
                      auVar188 = ZEXT3264(local_4c0);
                      auVar187 = ZEXT3264(local_4a0);
                      auVar186 = ZEXT3264(local_400);
                      auVar185 = ZEXT3264(local_480);
                      auVar179 = ZEXT3264(local_4e0);
                      auVar180 = ZEXT3264(local_520);
                      auVar184 = ZEXT3264(local_3c0);
                      auVar183 = ZEXT3264(local_3e0);
                      auVar168 = ZEXT1664(local_590);
                      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar182 = ZEXT3264(auVar96);
                      auVar75 = vxorps_avx512vl(auVar75,auVar75);
                      auVar181 = ZEXT1664(auVar75);
                      uVar170 = local_420._0_4_;
                    }
                    auVar75 = auVar189._0_16_;
                    auVar74 = *(undefined1 (*) [16])(local_550.ray + 0x80);
                    uVar65 = vptestmd_avx512vl(local_5b0,local_5b0);
                    uVar65 = uVar65 & 0xf;
                    auVar68 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar61 = (bool)((byte)uVar65 & 1);
                    auVar78._0_4_ = (uint)bVar61 * auVar68._0_4_ | (uint)!bVar61 * auVar74._0_4_;
                    bVar61 = (bool)((byte)(uVar65 >> 1) & 1);
                    auVar78._4_4_ = (uint)bVar61 * auVar68._4_4_ | (uint)!bVar61 * auVar74._4_4_;
                    bVar61 = (bool)((byte)(uVar65 >> 2) & 1);
                    auVar78._8_4_ = (uint)bVar61 * auVar68._8_4_ | (uint)!bVar61 * auVar74._8_4_;
                    bVar61 = SUB81(uVar65 >> 3,0);
                    auVar78._12_4_ = (uint)bVar61 * auVar68._12_4_ | (uint)!bVar61 * auVar74._12_4_;
                    *(undefined1 (*) [16])(local_550.ray + 0x80) = auVar78;
                    if ((byte)uVar65 != 0) {
                      bVar61 = true;
                      goto LAB_0183a081;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar125;
                  lVar58 = 0;
                  local_360 = local_360 ^ 1L << ((ulong)local_2a0 & 0x3f);
                  for (uVar65 = local_360; (uVar65 & 1) == 0;
                      uVar65 = uVar65 >> 1 | 0x8000000000000000) {
                    lVar58 = lVar58 + 1;
                  }
                }
              }
            }
          }
        }
        bVar61 = false;
      }
    }
LAB_0183a081:
    if (8 < iVar8) {
      local_3a0 = vpbroadcastd_avx512vl();
      local_420 = vbroadcastss_avx512vl(auVar75);
      fStack_358 = 1.0 / (float)local_4f0._0_4_;
      local_4f0 = vpbroadcastd_avx512vl();
      local_4e0 = auVar179._0_32_;
      fStack_354 = fStack_358;
      fStack_350 = fStack_358;
      fStack_34c = fStack_358;
      fStack_348 = fStack_358;
      fStack_344 = fStack_358;
      local_2a0 = uVar170;
      uStack_29c = uVar170;
      uStack_298 = uVar170;
      uStack_294 = uVar170;
      uStack_290 = uVar170;
      uStack_28c = uVar170;
      uStack_288 = uVar170;
      uStack_284 = uVar170;
      local_360._0_4_ = fStack_358;
      local_360._4_4_ = fStack_358;
      for (lVar58 = 8; lVar58 < iVar8; lVar58 = lVar58 + 8) {
        auVar96 = vpbroadcastd_avx512vl();
        auVar80 = vpor_avx2(auVar96,_DAT_01fb4ba0);
        uVar21 = vpcmpd_avx512vl(auVar80,local_3a0,1);
        auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar58 * 4 + lVar63);
        auVar97 = *(undefined1 (*) [32])(lVar63 + 0x21fb768 + lVar58 * 4);
        auVar95 = *(undefined1 (*) [32])(lVar63 + 0x21fbbec + lVar58 * 4);
        auVar94 = *(undefined1 (*) [32])(lVar63 + 0x21fc070 + lVar58 * 4);
        local_4a0 = auVar187._0_32_;
        auVar81 = vmulps_avx512vl(local_4a0,auVar94);
        local_4c0 = auVar188._0_32_;
        auVar93 = vmulps_avx512vl(local_4c0,auVar94);
        auVar33._4_4_ = auVar94._4_4_ * (float)local_e0._4_4_;
        auVar33._0_4_ = auVar94._0_4_ * (float)local_e0._0_4_;
        auVar33._8_4_ = auVar94._8_4_ * fStack_d8;
        auVar33._12_4_ = auVar94._12_4_ * fStack_d4;
        auVar33._16_4_ = auVar94._16_4_ * fStack_d0;
        auVar33._20_4_ = auVar94._20_4_ * fStack_cc;
        auVar33._24_4_ = auVar94._24_4_ * fStack_c8;
        auVar33._28_4_ = auVar80._28_4_;
        local_480 = auVar185._0_32_;
        auVar80 = vfmadd231ps_avx512vl(auVar81,auVar95,local_480);
        auVar100 = auVar186._0_32_;
        auVar81 = vfmadd231ps_avx512vl(auVar93,auVar95,auVar100);
        auVar93 = vfmadd231ps_avx512vl(auVar33,auVar95,local_c0);
        auVar98 = auVar180._0_32_;
        auVar80 = vfmadd231ps_avx512vl(auVar80,auVar97,auVar98);
        auVar91 = auVar179._0_32_;
        auVar81 = vfmadd231ps_avx512vl(auVar81,auVar97,auVar91);
        auVar75 = vfmadd231ps_fma(auVar93,auVar97,local_a0);
        auVar99 = auVar183._0_32_;
        auVar84 = vfmadd231ps_avx512vl(auVar80,auVar96,auVar99);
        local_3c0 = auVar184._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar81,auVar96,local_3c0);
        auVar80 = *(undefined1 (*) [32])(bezier_basis1 + lVar58 * 4 + lVar63);
        auVar81 = *(undefined1 (*) [32])(lVar63 + 0x21fdb88 + lVar58 * 4);
        auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar96,local_80);
        auVar93 = *(undefined1 (*) [32])(lVar63 + 0x21fe00c + lVar58 * 4);
        auVar92 = *(undefined1 (*) [32])(lVar63 + 0x21fe490 + lVar58 * 4);
        auVar82 = vmulps_avx512vl(local_4a0,auVar92);
        auVar83 = vmulps_avx512vl(local_4c0,auVar92);
        auVar34._4_4_ = auVar92._4_4_ * (float)local_e0._4_4_;
        auVar34._0_4_ = auVar92._0_4_ * (float)local_e0._0_4_;
        auVar34._8_4_ = auVar92._8_4_ * fStack_d8;
        auVar34._12_4_ = auVar92._12_4_ * fStack_d4;
        auVar34._16_4_ = auVar92._16_4_ * fStack_d0;
        auVar34._20_4_ = auVar92._20_4_ * fStack_cc;
        auVar34._24_4_ = auVar92._24_4_ * fStack_c8;
        auVar34._28_4_ = uStack_c4;
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar93,local_480);
        auVar83 = vfmadd231ps_avx512vl(auVar83,auVar93,auVar100);
        auVar86 = vfmadd231ps_avx512vl(auVar34,auVar93,local_c0);
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar81,auVar98);
        auVar83 = vfmadd231ps_avx512vl(auVar83,auVar81,auVar91);
        auVar74 = vfmadd231ps_fma(auVar86,auVar81,local_a0);
        auVar86 = vfmadd231ps_avx512vl(auVar82,auVar80,auVar99);
        auVar87 = vfmadd231ps_avx512vl(auVar83,auVar80,local_3c0);
        auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar80,local_80);
        auVar88 = vmaxps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar74));
        auVar82 = vsubps_avx(auVar86,auVar84);
        auVar83 = vsubps_avx(auVar87,auVar85);
        auVar89 = vmulps_avx512vl(auVar85,auVar82);
        auVar90 = vmulps_avx512vl(auVar84,auVar83);
        auVar89 = vsubps_avx512vl(auVar89,auVar90);
        auVar90 = vmulps_avx512vl(auVar83,auVar83);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar82,auVar82);
        auVar88 = vmulps_avx512vl(auVar88,auVar88);
        auVar88 = vmulps_avx512vl(auVar88,auVar90);
        auVar89 = vmulps_avx512vl(auVar89,auVar89);
        uVar135 = vcmpps_avx512vl(auVar89,auVar88,2);
        bVar64 = (byte)uVar21 & (byte)uVar135;
        if (bVar64 == 0) {
          auVar180 = ZEXT3264(auVar98);
          auVar179 = ZEXT3264(auVar91);
        }
        else {
          auVar92 = vmulps_avx512vl(local_460,auVar92);
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar92);
          auVar81 = vfmadd213ps_avx512vl(auVar81,local_120,auVar93);
          auVar80 = vfmadd213ps_avx512vl(auVar80,local_100,auVar81);
          auVar94 = vmulps_avx512vl(local_460,auVar94);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_140,auVar94);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar95);
          auVar81 = vfmadd213ps_avx512vl(auVar96,local_100,auVar97);
          auVar96 = *(undefined1 (*) [32])(lVar63 + 0x21fc4f4 + lVar58 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar63 + 0x21fc978 + lVar58 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar63 + 0x21fcdfc + lVar58 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar63 + 0x21fd280 + lVar58 * 4);
          auVar93 = vmulps_avx512vl(local_4a0,auVar94);
          auVar92 = vmulps_avx512vl(local_4c0,auVar94);
          auVar94 = vmulps_avx512vl(local_460,auVar94);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar95,local_480);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar95,auVar100);
          auVar95 = vfmadd231ps_avx512vl(auVar94,local_140,auVar95);
          auVar94 = vfmadd231ps_avx512vl(auVar93,auVar97,auVar98);
          auVar93 = vfmadd231ps_avx512vl(auVar92,auVar97,auVar91);
          auVar97 = vfmadd231ps_avx512vl(auVar95,local_120,auVar97);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar99);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar96,local_3c0);
          auVar92 = vfmadd231ps_avx512vl(auVar97,local_100,auVar96);
          auVar96 = *(undefined1 (*) [32])(lVar63 + 0x21fe914 + lVar58 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar63 + 0x21ff21c + lVar58 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar63 + 0x21ff6a0 + lVar58 * 4);
          auVar88 = vmulps_avx512vl(local_4a0,auVar95);
          auVar89 = vmulps_avx512vl(local_4c0,auVar95);
          auVar95 = vmulps_avx512vl(local_460,auVar95);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar97,local_480);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar97,auVar100);
          auVar95 = vfmadd231ps_avx512vl(auVar95,local_140,auVar97);
          auVar97 = *(undefined1 (*) [32])(lVar63 + 0x21fed98 + lVar58 * 4);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar97,auVar98);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar97,auVar91);
          auVar97 = vfmadd231ps_avx512vl(auVar95,local_120,auVar97);
          auVar95 = vfmadd231ps_avx512vl(auVar88,auVar96,auVar99);
          auVar88 = vfmadd231ps_avx512vl(auVar89,auVar96,local_3c0);
          auVar97 = vfmadd231ps_avx512vl(auVar97,local_100,auVar96);
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar94,auVar89);
          vandps_avx512vl(auVar93,auVar89);
          auVar96 = vmaxps_avx(auVar89,auVar89);
          vandps_avx512vl(auVar92,auVar89);
          auVar96 = vmaxps_avx(auVar96,auVar89);
          uVar65 = vcmpps_avx512vl(auVar96,local_420,1);
          bVar11 = (bool)((byte)uVar65 & 1);
          auVar106._0_4_ = (float)((uint)bVar11 * auVar82._0_4_ | (uint)!bVar11 * auVar94._0_4_);
          bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar106._4_4_ = (float)((uint)bVar11 * auVar82._4_4_ | (uint)!bVar11 * auVar94._4_4_);
          bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar106._8_4_ = (float)((uint)bVar11 * auVar82._8_4_ | (uint)!bVar11 * auVar94._8_4_);
          bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar106._12_4_ = (float)((uint)bVar11 * auVar82._12_4_ | (uint)!bVar11 * auVar94._12_4_);
          bVar11 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar106._16_4_ = (float)((uint)bVar11 * auVar82._16_4_ | (uint)!bVar11 * auVar94._16_4_);
          bVar11 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar106._20_4_ = (float)((uint)bVar11 * auVar82._20_4_ | (uint)!bVar11 * auVar94._20_4_);
          bVar11 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar106._24_4_ = (float)((uint)bVar11 * auVar82._24_4_ | (uint)!bVar11 * auVar94._24_4_);
          bVar11 = SUB81(uVar65 >> 7,0);
          auVar106._28_4_ = (uint)bVar11 * auVar82._28_4_ | (uint)!bVar11 * auVar94._28_4_;
          bVar11 = (bool)((byte)uVar65 & 1);
          auVar107._0_4_ = (float)((uint)bVar11 * auVar83._0_4_ | (uint)!bVar11 * auVar93._0_4_);
          bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar107._4_4_ = (float)((uint)bVar11 * auVar83._4_4_ | (uint)!bVar11 * auVar93._4_4_);
          bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar107._8_4_ = (float)((uint)bVar11 * auVar83._8_4_ | (uint)!bVar11 * auVar93._8_4_);
          bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar107._12_4_ = (float)((uint)bVar11 * auVar83._12_4_ | (uint)!bVar11 * auVar93._12_4_);
          bVar11 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar107._16_4_ = (float)((uint)bVar11 * auVar83._16_4_ | (uint)!bVar11 * auVar93._16_4_);
          bVar11 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar107._20_4_ = (float)((uint)bVar11 * auVar83._20_4_ | (uint)!bVar11 * auVar93._20_4_);
          bVar11 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar107._24_4_ = (float)((uint)bVar11 * auVar83._24_4_ | (uint)!bVar11 * auVar93._24_4_);
          bVar11 = SUB81(uVar65 >> 7,0);
          auVar107._28_4_ = (uint)bVar11 * auVar83._28_4_ | (uint)!bVar11 * auVar93._28_4_;
          vandps_avx512vl(auVar95,auVar89);
          vandps_avx512vl(auVar88,auVar89);
          auVar96 = vmaxps_avx(auVar107,auVar107);
          vandps_avx512vl(auVar97,auVar89);
          auVar96 = vmaxps_avx(auVar96,auVar107);
          uVar65 = vcmpps_avx512vl(auVar96,local_420,1);
          bVar11 = (bool)((byte)uVar65 & 1);
          auVar108._0_4_ = (uint)bVar11 * auVar82._0_4_ | (uint)!bVar11 * auVar95._0_4_;
          bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar108._4_4_ = (uint)bVar11 * auVar82._4_4_ | (uint)!bVar11 * auVar95._4_4_;
          bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar108._8_4_ = (uint)bVar11 * auVar82._8_4_ | (uint)!bVar11 * auVar95._8_4_;
          bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar108._12_4_ = (uint)bVar11 * auVar82._12_4_ | (uint)!bVar11 * auVar95._12_4_;
          bVar11 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar108._16_4_ = (uint)bVar11 * auVar82._16_4_ | (uint)!bVar11 * auVar95._16_4_;
          bVar11 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar108._20_4_ = (uint)bVar11 * auVar82._20_4_ | (uint)!bVar11 * auVar95._20_4_;
          bVar11 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar108._24_4_ = (uint)bVar11 * auVar82._24_4_ | (uint)!bVar11 * auVar95._24_4_;
          bVar11 = SUB81(uVar65 >> 7,0);
          auVar108._28_4_ = (uint)bVar11 * auVar82._28_4_ | (uint)!bVar11 * auVar95._28_4_;
          bVar11 = (bool)((byte)uVar65 & 1);
          auVar109._0_4_ = (float)((uint)bVar11 * auVar83._0_4_ | (uint)!bVar11 * auVar88._0_4_);
          bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar109._4_4_ = (float)((uint)bVar11 * auVar83._4_4_ | (uint)!bVar11 * auVar88._4_4_);
          bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar109._8_4_ = (float)((uint)bVar11 * auVar83._8_4_ | (uint)!bVar11 * auVar88._8_4_);
          bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar109._12_4_ = (float)((uint)bVar11 * auVar83._12_4_ | (uint)!bVar11 * auVar88._12_4_);
          bVar11 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar109._16_4_ = (float)((uint)bVar11 * auVar83._16_4_ | (uint)!bVar11 * auVar88._16_4_);
          bVar11 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar109._20_4_ = (float)((uint)bVar11 * auVar83._20_4_ | (uint)!bVar11 * auVar88._20_4_);
          bVar11 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar109._24_4_ = (float)((uint)bVar11 * auVar83._24_4_ | (uint)!bVar11 * auVar88._24_4_);
          bVar11 = SUB81(uVar65 >> 7,0);
          auVar109._28_4_ = (uint)bVar11 * auVar83._28_4_ | (uint)!bVar11 * auVar88._28_4_;
          auVar172._8_4_ = 0x80000000;
          auVar172._0_8_ = 0x8000000080000000;
          auVar172._12_4_ = 0x80000000;
          auVar172._16_4_ = 0x80000000;
          auVar172._20_4_ = 0x80000000;
          auVar172._24_4_ = 0x80000000;
          auVar172._28_4_ = 0x80000000;
          auVar96 = vxorps_avx512vl(auVar108,auVar172);
          auVar88 = auVar181._0_32_;
          auVar97 = vfmadd213ps_avx512vl(auVar106,auVar106,auVar88);
          auVar68 = vfmadd231ps_fma(auVar97,auVar107,auVar107);
          auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar68));
          auVar178._8_4_ = 0xbf000000;
          auVar178._0_8_ = 0xbf000000bf000000;
          auVar178._12_4_ = 0xbf000000;
          auVar178._16_4_ = 0xbf000000;
          auVar178._20_4_ = 0xbf000000;
          auVar178._24_4_ = 0xbf000000;
          auVar178._28_4_ = 0xbf000000;
          fVar142 = auVar97._0_4_;
          fVar132 = auVar97._4_4_;
          fVar133 = auVar97._8_4_;
          fVar134 = auVar97._12_4_;
          fVar161 = auVar97._16_4_;
          fVar164 = auVar97._20_4_;
          fVar66 = auVar97._24_4_;
          auVar35._4_4_ = fVar132 * fVar132 * fVar132 * auVar68._4_4_ * -0.5;
          auVar35._0_4_ = fVar142 * fVar142 * fVar142 * auVar68._0_4_ * -0.5;
          auVar35._8_4_ = fVar133 * fVar133 * fVar133 * auVar68._8_4_ * -0.5;
          auVar35._12_4_ = fVar134 * fVar134 * fVar134 * auVar68._12_4_ * -0.5;
          auVar35._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
          auVar35._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
          auVar35._24_4_ = fVar66 * fVar66 * fVar66 * -0.0;
          auVar35._28_4_ = auVar107._28_4_;
          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar97 = vfmadd231ps_avx512vl(auVar35,auVar95,auVar97);
          auVar36._4_4_ = auVar107._4_4_ * auVar97._4_4_;
          auVar36._0_4_ = auVar107._0_4_ * auVar97._0_4_;
          auVar36._8_4_ = auVar107._8_4_ * auVar97._8_4_;
          auVar36._12_4_ = auVar107._12_4_ * auVar97._12_4_;
          auVar36._16_4_ = auVar107._16_4_ * auVar97._16_4_;
          auVar36._20_4_ = auVar107._20_4_ * auVar97._20_4_;
          auVar36._24_4_ = auVar107._24_4_ * auVar97._24_4_;
          auVar36._28_4_ = 0;
          auVar37._4_4_ = auVar97._4_4_ * -auVar106._4_4_;
          auVar37._0_4_ = auVar97._0_4_ * -auVar106._0_4_;
          auVar37._8_4_ = auVar97._8_4_ * -auVar106._8_4_;
          auVar37._12_4_ = auVar97._12_4_ * -auVar106._12_4_;
          auVar37._16_4_ = auVar97._16_4_ * -auVar106._16_4_;
          auVar37._20_4_ = auVar97._20_4_ * -auVar106._20_4_;
          auVar37._24_4_ = auVar97._24_4_ * -auVar106._24_4_;
          auVar37._28_4_ = auVar107._28_4_;
          auVar94 = vmulps_avx512vl(auVar97,auVar88);
          auVar97 = vfmadd213ps_avx512vl(auVar108,auVar108,auVar88);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar109,auVar109);
          auVar93 = vrsqrt14ps_avx512vl(auVar97);
          auVar97 = vmulps_avx512vl(auVar97,auVar178);
          fVar142 = auVar93._0_4_;
          fVar132 = auVar93._4_4_;
          fVar133 = auVar93._8_4_;
          fVar134 = auVar93._12_4_;
          fVar161 = auVar93._16_4_;
          fVar164 = auVar93._20_4_;
          fVar66 = auVar93._24_4_;
          auVar38._4_4_ = fVar132 * fVar132 * fVar132 * auVar97._4_4_;
          auVar38._0_4_ = fVar142 * fVar142 * fVar142 * auVar97._0_4_;
          auVar38._8_4_ = fVar133 * fVar133 * fVar133 * auVar97._8_4_;
          auVar38._12_4_ = fVar134 * fVar134 * fVar134 * auVar97._12_4_;
          auVar38._16_4_ = fVar161 * fVar161 * fVar161 * auVar97._16_4_;
          auVar38._20_4_ = fVar164 * fVar164 * fVar164 * auVar97._20_4_;
          auVar38._24_4_ = fVar66 * fVar66 * fVar66 * auVar97._24_4_;
          auVar38._28_4_ = auVar97._28_4_;
          auVar97 = vfmadd231ps_avx512vl(auVar38,auVar95,auVar93);
          auVar39._4_4_ = auVar109._4_4_ * auVar97._4_4_;
          auVar39._0_4_ = auVar109._0_4_ * auVar97._0_4_;
          auVar39._8_4_ = auVar109._8_4_ * auVar97._8_4_;
          auVar39._12_4_ = auVar109._12_4_ * auVar97._12_4_;
          auVar39._16_4_ = auVar109._16_4_ * auVar97._16_4_;
          auVar39._20_4_ = auVar109._20_4_ * auVar97._20_4_;
          auVar39._24_4_ = auVar109._24_4_ * auVar97._24_4_;
          auVar39._28_4_ = auVar93._28_4_;
          auVar40._4_4_ = auVar97._4_4_ * auVar96._4_4_;
          auVar40._0_4_ = auVar97._0_4_ * auVar96._0_4_;
          auVar40._8_4_ = auVar97._8_4_ * auVar96._8_4_;
          auVar40._12_4_ = auVar97._12_4_ * auVar96._12_4_;
          auVar40._16_4_ = auVar97._16_4_ * auVar96._16_4_;
          auVar40._20_4_ = auVar97._20_4_ * auVar96._20_4_;
          auVar40._24_4_ = auVar97._24_4_ * auVar96._24_4_;
          auVar40._28_4_ = auVar96._28_4_;
          auVar96 = vmulps_avx512vl(auVar97,auVar88);
          auVar68 = vfmadd213ps_fma(auVar36,ZEXT1632(auVar75),auVar84);
          auVar97 = ZEXT1632(auVar75);
          auVar17 = vfmadd213ps_fma(auVar37,auVar97,auVar85);
          auVar95 = vfmadd213ps_avx512vl(auVar94,auVar97,auVar81);
          auVar93 = vfmadd213ps_avx512vl(auVar39,ZEXT1632(auVar74),auVar86);
          auVar70 = vfnmadd213ps_fma(auVar36,auVar97,auVar84);
          auVar92 = ZEXT1632(auVar74);
          auVar76 = vfmadd213ps_fma(auVar40,auVar92,auVar87);
          auVar20 = vfnmadd213ps_fma(auVar37,auVar97,auVar85);
          auVar69 = vfmadd213ps_fma(auVar96,auVar92,auVar80);
          auVar85 = ZEXT1632(auVar75);
          auVar72 = vfnmadd231ps_fma(auVar81,auVar85,auVar94);
          auVar71 = vfnmadd213ps_fma(auVar39,auVar92,auVar86);
          auVar73 = vfnmadd213ps_fma(auVar40,auVar92,auVar87);
          auVar77 = vfnmadd231ps_fma(auVar80,ZEXT1632(auVar74),auVar96);
          auVar80 = vsubps_avx512vl(auVar93,ZEXT1632(auVar70));
          auVar96 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar20));
          auVar97 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar72));
          auVar41._4_4_ = auVar96._4_4_ * auVar72._4_4_;
          auVar41._0_4_ = auVar96._0_4_ * auVar72._0_4_;
          auVar41._8_4_ = auVar96._8_4_ * auVar72._8_4_;
          auVar41._12_4_ = auVar96._12_4_ * auVar72._12_4_;
          auVar41._16_4_ = auVar96._16_4_ * 0.0;
          auVar41._20_4_ = auVar96._20_4_ * 0.0;
          auVar41._24_4_ = auVar96._24_4_ * 0.0;
          auVar41._28_4_ = auVar94._28_4_;
          auVar75 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar20),auVar97);
          auVar42._4_4_ = auVar97._4_4_ * auVar70._4_4_;
          auVar42._0_4_ = auVar97._0_4_ * auVar70._0_4_;
          auVar42._8_4_ = auVar97._8_4_ * auVar70._8_4_;
          auVar42._12_4_ = auVar97._12_4_ * auVar70._12_4_;
          auVar42._16_4_ = auVar97._16_4_ * 0.0;
          auVar42._20_4_ = auVar97._20_4_ * 0.0;
          auVar42._24_4_ = auVar97._24_4_ * 0.0;
          auVar42._28_4_ = auVar97._28_4_;
          auVar18 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar72),auVar80);
          auVar43._4_4_ = auVar20._4_4_ * auVar80._4_4_;
          auVar43._0_4_ = auVar20._0_4_ * auVar80._0_4_;
          auVar43._8_4_ = auVar20._8_4_ * auVar80._8_4_;
          auVar43._12_4_ = auVar20._12_4_ * auVar80._12_4_;
          auVar43._16_4_ = auVar80._16_4_ * 0.0;
          auVar43._20_4_ = auVar80._20_4_ * 0.0;
          auVar43._24_4_ = auVar80._24_4_ * 0.0;
          auVar43._28_4_ = auVar80._28_4_;
          auVar19 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar70),auVar96);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar19),auVar88,ZEXT1632(auVar18));
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar88,ZEXT1632(auVar75));
          uVar65 = vcmpps_avx512vl(auVar96,auVar88,2);
          bVar57 = (byte)uVar65;
          fVar117 = (float)((uint)(bVar57 & 1) * auVar68._0_4_ |
                           (uint)!(bool)(bVar57 & 1) * auVar71._0_4_);
          bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
          fVar119 = (float)((uint)bVar11 * auVar68._4_4_ | (uint)!bVar11 * auVar71._4_4_);
          bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
          fVar122 = (float)((uint)bVar11 * auVar68._8_4_ | (uint)!bVar11 * auVar71._8_4_);
          bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
          fVar123 = (float)((uint)bVar11 * auVar68._12_4_ | (uint)!bVar11 * auVar71._12_4_);
          auVar92 = ZEXT1632(CONCAT412(fVar123,CONCAT48(fVar122,CONCAT44(fVar119,fVar117))));
          fVar118 = (float)((uint)(bVar57 & 1) * auVar17._0_4_ |
                           (uint)!(bool)(bVar57 & 1) * auVar73._0_4_);
          bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
          fVar121 = (float)((uint)bVar11 * auVar17._4_4_ | (uint)!bVar11 * auVar73._4_4_);
          bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
          fVar120 = (float)((uint)bVar11 * auVar17._8_4_ | (uint)!bVar11 * auVar73._8_4_);
          bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
          fVar124 = (float)((uint)bVar11 * auVar17._12_4_ | (uint)!bVar11 * auVar73._12_4_);
          auVar82 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar120,CONCAT44(fVar121,fVar118))));
          auVar110._0_4_ =
               (float)((uint)(bVar57 & 1) * auVar95._0_4_ |
                      (uint)!(bool)(bVar57 & 1) * auVar77._0_4_);
          bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar110._4_4_ = (float)((uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * auVar77._4_4_);
          bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar110._8_4_ = (float)((uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * auVar77._8_4_);
          bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar110._12_4_ = (float)((uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * auVar77._12_4_);
          fVar133 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar95._16_4_);
          auVar110._16_4_ = fVar133;
          fVar132 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar95._20_4_);
          auVar110._20_4_ = fVar132;
          fVar142 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar95._24_4_);
          auVar110._24_4_ = fVar142;
          iVar1 = (uint)(byte)(uVar65 >> 7) * auVar95._28_4_;
          auVar110._28_4_ = iVar1;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar70),auVar93);
          auVar111._0_4_ =
               (uint)(bVar57 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar75._0_4_;
          bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar111._4_4_ = (uint)bVar11 * auVar96._4_4_ | (uint)!bVar11 * auVar75._4_4_;
          bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar111._8_4_ = (uint)bVar11 * auVar96._8_4_ | (uint)!bVar11 * auVar75._8_4_;
          bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar111._12_4_ = (uint)bVar11 * auVar96._12_4_ | (uint)!bVar11 * auVar75._12_4_;
          auVar111._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * auVar96._16_4_;
          auVar111._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * auVar96._20_4_;
          auVar111._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * auVar96._24_4_;
          auVar111._28_4_ = (uint)(byte)(uVar65 >> 7) * auVar96._28_4_;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar20),ZEXT1632(auVar76));
          auVar112._0_4_ =
               (float)((uint)(bVar57 & 1) * auVar96._0_4_ |
                      (uint)!(bool)(bVar57 & 1) * auVar68._0_4_);
          bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar112._4_4_ = (float)((uint)bVar11 * auVar96._4_4_ | (uint)!bVar11 * auVar68._4_4_);
          bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar112._8_4_ = (float)((uint)bVar11 * auVar96._8_4_ | (uint)!bVar11 * auVar68._8_4_);
          bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar112._12_4_ = (float)((uint)bVar11 * auVar96._12_4_ | (uint)!bVar11 * auVar68._12_4_);
          fVar134 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar96._16_4_);
          auVar112._16_4_ = fVar134;
          fVar161 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar96._20_4_);
          auVar112._20_4_ = fVar161;
          fVar164 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar96._24_4_);
          auVar112._24_4_ = fVar164;
          auVar112._28_4_ = (uint)(byte)(uVar65 >> 7) * auVar96._28_4_;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar72),ZEXT1632(auVar69));
          auVar113._0_4_ =
               (float)((uint)(bVar57 & 1) * auVar96._0_4_ |
                      (uint)!(bool)(bVar57 & 1) * auVar17._0_4_);
          bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar113._4_4_ = (float)((uint)bVar11 * auVar96._4_4_ | (uint)!bVar11 * auVar17._4_4_);
          bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar113._8_4_ = (float)((uint)bVar11 * auVar96._8_4_ | (uint)!bVar11 * auVar17._8_4_);
          bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar113._12_4_ = (float)((uint)bVar11 * auVar96._12_4_ | (uint)!bVar11 * auVar17._12_4_);
          fVar67 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar96._16_4_);
          auVar113._16_4_ = fVar67;
          fVar116 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar96._20_4_);
          auVar113._20_4_ = fVar116;
          fVar66 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar96._24_4_);
          auVar113._24_4_ = fVar66;
          iVar2 = (uint)(byte)(uVar65 >> 7) * auVar96._28_4_;
          auVar113._28_4_ = iVar2;
          auVar114._0_4_ =
               (uint)(bVar57 & 1) * (int)auVar70._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar93._0_4_;
          bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar114._4_4_ = (uint)bVar11 * (int)auVar70._4_4_ | (uint)!bVar11 * auVar93._4_4_;
          bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar114._8_4_ = (uint)bVar11 * (int)auVar70._8_4_ | (uint)!bVar11 * auVar93._8_4_;
          bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar114._12_4_ = (uint)bVar11 * (int)auVar70._12_4_ | (uint)!bVar11 * auVar93._12_4_;
          auVar114._16_4_ = (uint)!(bool)((byte)(uVar65 >> 4) & 1) * auVar93._16_4_;
          auVar114._20_4_ = (uint)!(bool)((byte)(uVar65 >> 5) & 1) * auVar93._20_4_;
          auVar114._24_4_ = (uint)!(bool)((byte)(uVar65 >> 6) & 1) * auVar93._24_4_;
          auVar114._28_4_ = (uint)!SUB81(uVar65 >> 7,0) * auVar93._28_4_;
          bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar65 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar65 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar93 = vsubps_avx512vl(auVar114,auVar92);
          auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar20._12_4_ |
                                                  (uint)!bVar15 * auVar76._12_4_,
                                                  CONCAT48((uint)bVar14 * (int)auVar20._8_4_ |
                                                           (uint)!bVar14 * auVar76._8_4_,
                                                           CONCAT44((uint)bVar11 *
                                                                    (int)auVar20._4_4_ |
                                                                    (uint)!bVar11 * auVar76._4_4_,
                                                                    (uint)(bVar57 & 1) *
                                                                    (int)auVar20._0_4_ |
                                                                    (uint)!(bool)(bVar57 & 1) *
                                                                    auVar76._0_4_)))),auVar82);
          auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar72._12_4_ |
                                                  (uint)!bVar16 * auVar69._12_4_,
                                                  CONCAT48((uint)bVar13 * (int)auVar72._8_4_ |
                                                           (uint)!bVar13 * auVar69._8_4_,
                                                           CONCAT44((uint)bVar12 *
                                                                    (int)auVar72._4_4_ |
                                                                    (uint)!bVar12 * auVar69._4_4_,
                                                                    (uint)(bVar57 & 1) *
                                                                    (int)auVar72._0_4_ |
                                                                    (uint)!(bool)(bVar57 & 1) *
                                                                    auVar69._0_4_)))),auVar110);
          auVar94 = vsubps_avx(auVar92,auVar111);
          auVar80 = vsubps_avx(auVar82,auVar112);
          auVar81 = vsubps_avx(auVar110,auVar113);
          auVar44._4_4_ = auVar95._4_4_ * fVar119;
          auVar44._0_4_ = auVar95._0_4_ * fVar117;
          auVar44._8_4_ = auVar95._8_4_ * fVar122;
          auVar44._12_4_ = auVar95._12_4_ * fVar123;
          auVar44._16_4_ = auVar95._16_4_ * 0.0;
          auVar44._20_4_ = auVar95._20_4_ * 0.0;
          auVar44._24_4_ = auVar95._24_4_ * 0.0;
          auVar44._28_4_ = 0;
          auVar75 = vfmsub231ps_fma(auVar44,auVar110,auVar93);
          auVar150._0_4_ = fVar118 * auVar93._0_4_;
          auVar150._4_4_ = fVar121 * auVar93._4_4_;
          auVar150._8_4_ = fVar120 * auVar93._8_4_;
          auVar150._12_4_ = fVar124 * auVar93._12_4_;
          auVar150._16_4_ = auVar93._16_4_ * 0.0;
          auVar150._20_4_ = auVar93._20_4_ * 0.0;
          auVar150._24_4_ = auVar93._24_4_ * 0.0;
          auVar150._28_4_ = 0;
          auVar68 = vfmsub231ps_fma(auVar150,auVar92,auVar97);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),auVar88,ZEXT1632(auVar75));
          auVar155._0_4_ = auVar97._0_4_ * auVar110._0_4_;
          auVar155._4_4_ = auVar97._4_4_ * auVar110._4_4_;
          auVar155._8_4_ = auVar97._8_4_ * auVar110._8_4_;
          auVar155._12_4_ = auVar97._12_4_ * auVar110._12_4_;
          auVar155._16_4_ = auVar97._16_4_ * fVar133;
          auVar155._20_4_ = auVar97._20_4_ * fVar132;
          auVar155._24_4_ = auVar97._24_4_ * fVar142;
          auVar155._28_4_ = 0;
          auVar75 = vfmsub231ps_fma(auVar155,auVar82,auVar95);
          auVar83 = vfmadd231ps_avx512vl(auVar96,auVar88,ZEXT1632(auVar75));
          auVar96 = vmulps_avx512vl(auVar81,auVar111);
          auVar96 = vfmsub231ps_avx512vl(auVar96,auVar94,auVar113);
          auVar45._4_4_ = auVar80._4_4_ * auVar113._4_4_;
          auVar45._0_4_ = auVar80._0_4_ * auVar113._0_4_;
          auVar45._8_4_ = auVar80._8_4_ * auVar113._8_4_;
          auVar45._12_4_ = auVar80._12_4_ * auVar113._12_4_;
          auVar45._16_4_ = auVar80._16_4_ * fVar67;
          auVar45._20_4_ = auVar80._20_4_ * fVar116;
          auVar45._24_4_ = auVar80._24_4_ * fVar66;
          auVar45._28_4_ = iVar2;
          auVar75 = vfmsub231ps_fma(auVar45,auVar112,auVar81);
          auVar156._0_4_ = auVar112._0_4_ * auVar94._0_4_;
          auVar156._4_4_ = auVar112._4_4_ * auVar94._4_4_;
          auVar156._8_4_ = auVar112._8_4_ * auVar94._8_4_;
          auVar156._12_4_ = auVar112._12_4_ * auVar94._12_4_;
          auVar156._16_4_ = fVar134 * auVar94._16_4_;
          auVar156._20_4_ = fVar161 * auVar94._20_4_;
          auVar156._24_4_ = fVar164 * auVar94._24_4_;
          auVar156._28_4_ = 0;
          auVar68 = vfmsub231ps_fma(auVar156,auVar80,auVar111);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),auVar88,auVar96);
          auVar84 = vfmadd231ps_avx512vl(auVar96,auVar88,ZEXT1632(auVar75));
          auVar96 = vmaxps_avx(auVar83,auVar84);
          uVar135 = vcmpps_avx512vl(auVar96,auVar88,2);
          bVar64 = bVar64 & (byte)uVar135;
          if (bVar64 != 0) {
            auVar46._4_4_ = auVar81._4_4_ * auVar97._4_4_;
            auVar46._0_4_ = auVar81._0_4_ * auVar97._0_4_;
            auVar46._8_4_ = auVar81._8_4_ * auVar97._8_4_;
            auVar46._12_4_ = auVar81._12_4_ * auVar97._12_4_;
            auVar46._16_4_ = auVar81._16_4_ * auVar97._16_4_;
            auVar46._20_4_ = auVar81._20_4_ * auVar97._20_4_;
            auVar46._24_4_ = auVar81._24_4_ * auVar97._24_4_;
            auVar46._28_4_ = auVar96._28_4_;
            auVar17 = vfmsub231ps_fma(auVar46,auVar80,auVar95);
            auVar47._4_4_ = auVar95._4_4_ * auVar94._4_4_;
            auVar47._0_4_ = auVar95._0_4_ * auVar94._0_4_;
            auVar47._8_4_ = auVar95._8_4_ * auVar94._8_4_;
            auVar47._12_4_ = auVar95._12_4_ * auVar94._12_4_;
            auVar47._16_4_ = auVar95._16_4_ * auVar94._16_4_;
            auVar47._20_4_ = auVar95._20_4_ * auVar94._20_4_;
            auVar47._24_4_ = auVar95._24_4_ * auVar94._24_4_;
            auVar47._28_4_ = auVar95._28_4_;
            auVar68 = vfmsub231ps_fma(auVar47,auVar93,auVar81);
            auVar48._4_4_ = auVar80._4_4_ * auVar93._4_4_;
            auVar48._0_4_ = auVar80._0_4_ * auVar93._0_4_;
            auVar48._8_4_ = auVar80._8_4_ * auVar93._8_4_;
            auVar48._12_4_ = auVar80._12_4_ * auVar93._12_4_;
            auVar48._16_4_ = auVar80._16_4_ * auVar93._16_4_;
            auVar48._20_4_ = auVar80._20_4_ * auVar93._20_4_;
            auVar48._24_4_ = auVar80._24_4_ * auVar93._24_4_;
            auVar48._28_4_ = auVar80._28_4_;
            auVar76 = vfmsub231ps_fma(auVar48,auVar94,auVar97);
            auVar75 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar68),ZEXT1632(auVar76));
            auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar17),auVar88);
            auVar97 = vrcp14ps_avx512vl(auVar96);
            auVar94 = auVar182._0_32_;
            auVar95 = vfnmadd213ps_avx512vl(auVar97,auVar96,auVar94);
            auVar75 = vfmadd132ps_fma(auVar95,auVar97,auVar97);
            auVar49._4_4_ = auVar76._4_4_ * auVar110._4_4_;
            auVar49._0_4_ = auVar76._0_4_ * auVar110._0_4_;
            auVar49._8_4_ = auVar76._8_4_ * auVar110._8_4_;
            auVar49._12_4_ = auVar76._12_4_ * auVar110._12_4_;
            auVar49._16_4_ = fVar133 * 0.0;
            auVar49._20_4_ = fVar132 * 0.0;
            auVar49._24_4_ = fVar142 * 0.0;
            auVar49._28_4_ = iVar1;
            auVar68 = vfmadd231ps_fma(auVar49,auVar82,ZEXT1632(auVar68));
            auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar92,ZEXT1632(auVar17));
            fVar142 = auVar75._0_4_;
            fVar132 = auVar75._4_4_;
            fVar133 = auVar75._8_4_;
            fVar134 = auVar75._12_4_;
            local_220 = ZEXT1632(CONCAT412(auVar68._12_4_ * fVar134,
                                           CONCAT48(auVar68._8_4_ * fVar133,
                                                    CONCAT44(auVar68._4_4_ * fVar132,
                                                             auVar68._0_4_ * fVar142))));
            auVar56._4_4_ = uStack_29c;
            auVar56._0_4_ = local_2a0;
            auVar56._8_4_ = uStack_298;
            auVar56._12_4_ = uStack_294;
            auVar56._16_4_ = uStack_290;
            auVar56._20_4_ = uStack_28c;
            auVar56._24_4_ = uStack_288;
            auVar56._28_4_ = uStack_284;
            uVar135 = vcmpps_avx512vl(local_220,auVar56,0xd);
            uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar25._4_4_ = uVar125;
            auVar25._0_4_ = uVar125;
            auVar25._8_4_ = uVar125;
            auVar25._12_4_ = uVar125;
            auVar25._16_4_ = uVar125;
            auVar25._20_4_ = uVar125;
            auVar25._24_4_ = uVar125;
            auVar25._28_4_ = uVar125;
            uVar21 = vcmpps_avx512vl(local_220,auVar25,2);
            bVar64 = (byte)uVar135 & (byte)uVar21 & bVar64;
            if (bVar64 != 0) {
              uVar135 = vcmpps_avx512vl(auVar96,auVar88,4);
              bVar64 = bVar64 & (byte)uVar135;
              auVar189 = ZEXT1664(local_590);
              auVar180 = ZEXT3264(local_520);
              auVar179 = ZEXT3264(local_4e0);
              if (bVar64 != 0) {
                fVar161 = auVar83._0_4_ * fVar142;
                fVar164 = auVar83._4_4_ * fVar132;
                auVar50._4_4_ = fVar164;
                auVar50._0_4_ = fVar161;
                fVar66 = auVar83._8_4_ * fVar133;
                auVar50._8_4_ = fVar66;
                fVar67 = auVar83._12_4_ * fVar134;
                auVar50._12_4_ = fVar67;
                fVar116 = auVar83._16_4_ * 0.0;
                auVar50._16_4_ = fVar116;
                fVar117 = auVar83._20_4_ * 0.0;
                auVar50._20_4_ = fVar117;
                fVar118 = auVar83._24_4_ * 0.0;
                auVar50._24_4_ = fVar118;
                auVar50._28_4_ = auVar96._28_4_;
                auVar97 = vsubps_avx512vl(auVar94,auVar50);
                local_260._0_4_ =
                     (float)((uint)(bVar57 & 1) * (int)fVar161 |
                            (uint)!(bool)(bVar57 & 1) * auVar97._0_4_);
                bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
                local_260._4_4_ =
                     (float)((uint)bVar11 * (int)fVar164 | (uint)!bVar11 * auVar97._4_4_);
                bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
                local_260._8_4_ =
                     (float)((uint)bVar11 * (int)fVar66 | (uint)!bVar11 * auVar97._8_4_);
                bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
                local_260._12_4_ =
                     (float)((uint)bVar11 * (int)fVar67 | (uint)!bVar11 * auVar97._12_4_);
                bVar11 = (bool)((byte)(uVar65 >> 4) & 1);
                local_260._16_4_ =
                     (float)((uint)bVar11 * (int)fVar116 | (uint)!bVar11 * auVar97._16_4_);
                bVar11 = (bool)((byte)(uVar65 >> 5) & 1);
                local_260._20_4_ =
                     (float)((uint)bVar11 * (int)fVar117 | (uint)!bVar11 * auVar97._20_4_);
                bVar11 = (bool)((byte)(uVar65 >> 6) & 1);
                local_260._24_4_ =
                     (float)((uint)bVar11 * (int)fVar118 | (uint)!bVar11 * auVar97._24_4_);
                bVar11 = SUB81(uVar65 >> 7,0);
                local_260._28_4_ =
                     (float)((uint)bVar11 * auVar96._28_4_ | (uint)!bVar11 * auVar97._28_4_);
                auVar96 = vsubps_avx(ZEXT1632(auVar74),auVar85);
                auVar75 = vfmadd213ps_fma(auVar96,local_260,auVar85);
                uVar125 = *(undefined4 *)((long)local_558->ray_space + k * 4 + -0x10);
                auVar26._4_4_ = uVar125;
                auVar26._0_4_ = uVar125;
                auVar26._8_4_ = uVar125;
                auVar26._12_4_ = uVar125;
                auVar26._16_4_ = uVar125;
                auVar26._20_4_ = uVar125;
                auVar26._24_4_ = uVar125;
                auVar26._28_4_ = uVar125;
                auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar75._12_4_ + auVar75._12_4_,
                                                             CONCAT48(auVar75._8_4_ + auVar75._8_4_,
                                                                      CONCAT44(auVar75._4_4_ +
                                                                               auVar75._4_4_,
                                                                               auVar75._0_4_ +
                                                                               auVar75._0_4_)))),
                                          auVar26);
                uVar135 = vcmpps_avx512vl(local_220,auVar96,6);
                if (((byte)uVar135 & bVar64) != 0) {
                  auVar138._0_4_ = auVar84._0_4_ * fVar142;
                  auVar138._4_4_ = auVar84._4_4_ * fVar132;
                  auVar138._8_4_ = auVar84._8_4_ * fVar133;
                  auVar138._12_4_ = auVar84._12_4_ * fVar134;
                  auVar138._16_4_ = auVar84._16_4_ * 0.0;
                  auVar138._20_4_ = auVar84._20_4_ * 0.0;
                  auVar138._24_4_ = auVar84._24_4_ * 0.0;
                  auVar138._28_4_ = 0;
                  auVar96 = vsubps_avx512vl(auVar94,auVar138);
                  auVar115._0_4_ =
                       (uint)(bVar57 & 1) * (int)auVar138._0_4_ |
                       (uint)!(bool)(bVar57 & 1) * auVar96._0_4_;
                  bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
                  auVar115._4_4_ =
                       (uint)bVar11 * (int)auVar138._4_4_ | (uint)!bVar11 * auVar96._4_4_;
                  bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
                  auVar115._8_4_ =
                       (uint)bVar11 * (int)auVar138._8_4_ | (uint)!bVar11 * auVar96._8_4_;
                  bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
                  auVar115._12_4_ =
                       (uint)bVar11 * (int)auVar138._12_4_ | (uint)!bVar11 * auVar96._12_4_;
                  bVar11 = (bool)((byte)(uVar65 >> 4) & 1);
                  auVar115._16_4_ =
                       (uint)bVar11 * (int)auVar138._16_4_ | (uint)!bVar11 * auVar96._16_4_;
                  bVar11 = (bool)((byte)(uVar65 >> 5) & 1);
                  auVar115._20_4_ =
                       (uint)bVar11 * (int)auVar138._20_4_ | (uint)!bVar11 * auVar96._20_4_;
                  bVar11 = (bool)((byte)(uVar65 >> 6) & 1);
                  auVar115._24_4_ =
                       (uint)bVar11 * (int)auVar138._24_4_ | (uint)!bVar11 * auVar96._24_4_;
                  auVar115._28_4_ = (uint)!SUB81(uVar65 >> 7,0) * auVar96._28_4_;
                  auVar27._8_4_ = 0x40000000;
                  auVar27._0_8_ = 0x4000000040000000;
                  auVar27._12_4_ = 0x40000000;
                  auVar27._16_4_ = 0x40000000;
                  auVar27._20_4_ = 0x40000000;
                  auVar27._24_4_ = 0x40000000;
                  auVar27._28_4_ = 0x40000000;
                  local_240 = vfmsub132ps_avx512vl(auVar115,auVar94,auVar27);
                  local_200 = (undefined4)lVar58;
                  local_1f0 = local_590;
                  local_1e0 = local_570;
                  uStack_1d8 = uStack_568;
                  local_1d0 = local_580;
                  uStack_1c8 = uStack_578;
                  pGVar9 = (context->scene->geometries).items[local_598].ptr;
                  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    bVar57 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar57 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar75 = vcvtsi2ss_avx512f(auVar181._0_16_,local_200);
                    fVar142 = auVar75._0_4_;
                    local_1a0[0] = (fVar142 + local_260._0_4_ + 0.0) * (float)local_360;
                    local_1a0[1] = (fVar142 + local_260._4_4_ + 1.0) * local_360._4_4_;
                    local_1a0[2] = (fVar142 + local_260._8_4_ + 2.0) * fStack_358;
                    local_1a0[3] = (fVar142 + local_260._12_4_ + 3.0) * fStack_354;
                    fStack_190 = (fVar142 + local_260._16_4_ + 4.0) * fStack_350;
                    fStack_18c = (fVar142 + local_260._20_4_ + 5.0) * fStack_34c;
                    fStack_188 = (fVar142 + local_260._24_4_ + 6.0) * fStack_348;
                    fStack_184 = fVar142 + local_260._28_4_ + 7.0;
                    local_180 = local_240;
                    local_160 = local_220;
                    uVar65 = 0;
                    uVar59 = (ulong)((byte)uVar135 & bVar64);
                    for (uVar60 = uVar59; local_560 = pGVar9, local_1fc = iVar8, (uVar60 & 1) == 0;
                        uVar60 = uVar60 >> 1 | 0x8000000000000000) {
                      uVar65 = uVar65 + 1;
                    }
                    while (auVar75 = auVar181._0_16_, uVar59 != 0) {
                      uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_300 = local_1a0[uVar65];
                      local_2f0 = *(undefined4 *)(local_180 + uVar65 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar65 * 4);
                      local_550.context = context->user;
                      fVar132 = 1.0 - local_300;
                      fVar142 = fVar132 * fVar132 * -3.0;
                      auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * fVar132)),
                                                ZEXT416((uint)(local_300 * fVar132)),
                                                ZEXT416(0xc0000000));
                      auVar74 = vfmsub132ss_fma(ZEXT416((uint)(local_300 * fVar132)),
                                                ZEXT416((uint)(local_300 * local_300)),
                                                ZEXT416(0x40000000));
                      fVar132 = auVar75._0_4_ * 3.0;
                      fVar133 = auVar74._0_4_ * 3.0;
                      fVar134 = local_300 * local_300 * 3.0;
                      auVar160._0_4_ = fVar134 * local_440;
                      auVar160._4_4_ = fVar134 * fStack_43c;
                      auVar160._8_4_ = fVar134 * fStack_438;
                      auVar160._12_4_ = fVar134 * fStack_434;
                      auVar130._4_4_ = fVar133;
                      auVar130._0_4_ = fVar133;
                      auVar130._8_4_ = fVar133;
                      auVar130._12_4_ = fVar133;
                      auVar52._8_8_ = uStack_578;
                      auVar52._0_8_ = local_580;
                      auVar75 = vfmadd132ps_fma(auVar130,auVar160,auVar52);
                      auVar149._4_4_ = fVar132;
                      auVar149._0_4_ = fVar132;
                      auVar149._8_4_ = fVar132;
                      auVar149._12_4_ = fVar132;
                      auVar54._8_8_ = uStack_568;
                      auVar54._0_8_ = local_570;
                      auVar75 = vfmadd132ps_fma(auVar149,auVar75,auVar54);
                      auVar131._4_4_ = fVar142;
                      auVar131._0_4_ = fVar142;
                      auVar131._8_4_ = fVar142;
                      auVar131._12_4_ = fVar142;
                      auVar75 = vfmadd213ps_fma(auVar131,auVar189._0_16_,auVar75);
                      local_330 = auVar75._0_4_;
                      local_320 = vshufps_avx(auVar75,auVar75,0x55);
                      local_310 = vshufps_avx(auVar75,auVar75,0xaa);
                      local_2e0 = local_370._0_8_;
                      uStack_2d8 = local_370._8_8_;
                      local_2d0 = local_4f0;
                      vpcmpeqd_avx2(ZEXT1632(local_4f0),ZEXT1632(local_4f0));
                      uStack_2bc = (local_550.context)->instID[0];
                      local_2c0 = uStack_2bc;
                      uStack_2b8 = uStack_2bc;
                      uStack_2b4 = uStack_2bc;
                      uStack_2b0 = (local_550.context)->instPrimID[0];
                      uStack_2ac = uStack_2b0;
                      uStack_2a8 = uStack_2b0;
                      uStack_2a4 = uStack_2b0;
                      local_5b0 = local_380;
                      local_550.valid = (int *)local_5b0;
                      local_550.geometryUserPtr = local_560->userPtr;
                      local_550.hit = (RTCHitN *)&local_330;
                      local_550.N = 4;
                      local_500._0_8_ = uVar65;
                      uVar60 = uVar65;
                      local_550.ray = (RTCRayN *)ray;
                      uStack_32c = local_330;
                      uStack_328 = local_330;
                      uStack_324 = local_330;
                      fStack_2fc = local_300;
                      fStack_2f8 = local_300;
                      fStack_2f4 = local_300;
                      uStack_2ec = local_2f0;
                      uStack_2e8 = local_2f0;
                      uStack_2e4 = local_2f0;
                      if (local_560->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*local_560->occlusionFilterN)(&local_550);
                        auVar189 = ZEXT1664(local_590);
                        uVar60 = local_500._0_8_;
                      }
                      uVar65 = vptestmd_avx512vl(local_5b0,local_5b0);
                      if ((uVar65 & 0xf) != 0) {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((local_560->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var10)(&local_550);
                          auVar189 = ZEXT1664(local_590);
                          uVar60 = local_500._0_8_;
                        }
                        auVar75 = auVar181._0_16_;
                        auVar74 = *(undefined1 (*) [16])(local_550.ray + 0x80);
                        uVar65 = vptestmd_avx512vl(local_5b0,local_5b0);
                        uVar65 = uVar65 & 0xf;
                        auVar68 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar11 = (bool)((byte)uVar65 & 1);
                        auVar79._0_4_ = (uint)bVar11 * auVar68._0_4_ | (uint)!bVar11 * auVar74._0_4_
                        ;
                        bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
                        auVar79._4_4_ = (uint)bVar11 * auVar68._4_4_ | (uint)!bVar11 * auVar74._4_4_
                        ;
                        bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
                        auVar79._8_4_ = (uint)bVar11 * auVar68._8_4_ | (uint)!bVar11 * auVar74._8_4_
                        ;
                        bVar11 = SUB81(uVar65 >> 3,0);
                        auVar79._12_4_ =
                             (uint)bVar11 * auVar68._12_4_ | (uint)!bVar11 * auVar74._12_4_;
                        *(undefined1 (*) [16])(local_550.ray + 0x80) = auVar79;
                        if ((byte)uVar65 != 0) {
                          bVar57 = 1;
                          goto LAB_0183aaf5;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar125;
                      uVar65 = 0;
                      uVar59 = uVar59 ^ 1L << (uVar60 & 0x3f);
                      for (uVar60 = uVar59; (uVar60 & 1) == 0;
                          uVar60 = uVar60 >> 1 | 0x8000000000000000) {
                        uVar65 = uVar65 + 1;
                      }
                    }
                    bVar57 = 0;
LAB_0183aaf5:
                    auVar75 = vxorps_avx512vl(auVar75,auVar75);
                    auVar181 = ZEXT1664(auVar75);
                    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar182 = ZEXT3264(auVar96);
                    auVar183 = ZEXT3264(local_3e0);
                    auVar184 = ZEXT3264(local_3c0);
                    auVar180 = ZEXT3264(local_520);
                    auVar179 = ZEXT3264(local_4e0);
                    auVar185 = ZEXT3264(local_480);
                    auVar186 = ZEXT3264(local_400);
                    auVar187 = ZEXT3264(local_4a0);
                    auVar188 = ZEXT3264(local_4c0);
                  }
                  bVar61 = (bool)(bVar61 | bVar57);
                }
              }
              goto LAB_0183aad4;
            }
          }
          auVar180 = ZEXT3264(local_520);
          auVar179 = ZEXT3264(local_4e0);
        }
LAB_0183aad4:
      }
    }
    if (bVar61) break;
    uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar22._4_4_ = uVar125;
    auVar22._0_4_ = uVar125;
    auVar22._8_4_ = uVar125;
    auVar22._12_4_ = uVar125;
    uVar135 = vcmpps_avx512vl(local_270,auVar22,2);
    local_428 = (ulong)((uint)uVar62 & (uint)uVar135);
  }
  return local_428 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }